

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-tx.cpp
# Opt level: O1

int CommandLineRawTx(int argc,char **argv)

{
  anon_struct_16_2_9739c62b *paVar1;
  char *pcVar2;
  undefined1 *puVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  MutableTransactionSignatureCreator *pMVar6;
  undefined8 uVar7;
  Txid hashPrevTx;
  CScript scriptPubKeyIn;
  CScript scriptPubKeyIn_00;
  CScript scriptPubKeyIn_01;
  CScript scriptPubKeyIn_02;
  CScript scriptPubKeyIn_03;
  CScript scriptSigIn;
  undefined7 uVar8;
  MutableTransactionSignatureCreator *pMVar9;
  undefined1 auVar10 [16];
  pointer pCVar11;
  _Head_base<0UL,_ECC_Context_*,_false> _Var12;
  undefined8 uVar13;
  char cVar14;
  _Alloc_hider _Var15;
  bool bVar16;
  bool bVar17;
  int iVar18;
  uint uVar19;
  uint32_t uVar20;
  void *pvVar21;
  ECC_Context *pEVar22;
  byte *pbVar23;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  FILE *__stream;
  size_t sVar24;
  const_iterator cVar25;
  mapped_type *pmVar26;
  UniValue *pUVar27;
  ulong uVar28;
  UniValue *pUVar29;
  string *psVar30;
  Coin *pCVar31;
  CTxOut *txout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar32;
  undefined8 *puVar33;
  runtime_error *prVar34;
  size_type sVar35;
  _Alloc_hider _Var36;
  COutPoint *__comp;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar37;
  uint uVar38;
  MutableTransactionSignatureCreator *pMVar39;
  size_type __size;
  ulong uVar40;
  size_type sVar41;
  pointer pCVar42;
  anon_struct_16_2_9739c62b *paVar43;
  size_t sVar44;
  ulong uVar45;
  ulong uVar46;
  allocator_type *in_R8;
  pointer pcVar47;
  long lVar48;
  CScript *pCVar49;
  long *plVar50;
  long lVar51;
  CTxIn *input;
  MutableTransactionSignatureCreator *unaff_R15;
  long in_FS_OFFSET;
  undefined1 auVar52 [16];
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>_>
  __l;
  Span<const_unsigned_char> s;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view val;
  string_view separators;
  string_view separators_00;
  string_view separators_01;
  string_view separators_02;
  string_view separators_03;
  _Alloc_hider in_stack_ffffffffffffe988;
  undefined8 in_stack_ffffffffffffe990;
  undefined8 in_stack_ffffffffffffe998;
  undefined8 in_stack_ffffffffffffe9a0;
  undefined1 in_stack_ffffffffffffe9a8 [12];
  uint in_stack_ffffffffffffe9b4;
  undefined **ppuVar53;
  undefined4 in_stack_ffffffffffffe9c0;
  uint in_stack_ffffffffffffe9c4;
  CMutableTransaction tx;
  _Head_base<0UL,_ECC_Context_*,_false> local_15e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pkData;
  CCoinsView viewDummy;
  CMutableTransaction txv;
  CMutableTransaction mergedTx;
  string value;
  string key;
  string arg;
  string strPrint;
  char buf [4096];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>_>_>
  types;
  string local_478;
  string local_458;
  string local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  size_t i;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  CScript redeemScript;
  COutPoint out;
  CScript scriptPubKey;
  uint32_t numkeys;
  char cStack_364;
  char cStack_363;
  char cStack_362;
  char cStack_361;
  char acStack_360 [8];
  uchar local_358 [8];
  uchar auStack_350 [8];
  UniValue prevtxsObj;
  string valStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  vector<UniValue,_std::allocator<UniValue>_> local_2b0;
  string strHexTx;
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  local_260;
  __native_type _Stack_230;
  string filename;
  undefined1 uStack_1e4;
  undefined2 local_1e3;
  undefined1 local_1e1;
  undefined1 local_1e0 [24];
  vector<UniValue,_std::allocator<UniValue>_> avStack_1c8 [9];
  CoinsCachePair *local_e0;
  CoinsCachePair *local_d8;
  uint8_t local_d0;
  direct_or_indirect local_c0;
  uint local_a4;
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_98;
  long local_38;
  
  buf[0x498] = '\0';
  buf[0x499] = '\0';
  buf[0x49a] = '\0';
  buf[0x49b] = '\0';
  buf[0x49c] = '\0';
  buf[0x49d] = '\0';
  buf[0x49e] = '\0';
  buf[0x49f] = '\0';
  uVar40 = (ulong)(uint)argc;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  strPrint._M_dataplus._M_p = (pointer)&strPrint.field_2;
  strPrint._M_string_length = 0;
  strPrint.field_2._M_local_buf[0] = '\0';
  if (1 < argc) {
    do {
      if ((*argv[1] != '-') || (argv[1][1] == '\0')) goto LAB_001179f6;
      argv = argv + 1;
      iVar18 = (int)uVar40;
      uVar40 = (ulong)(iVar18 - 1);
    } while (2 < iVar18);
    uVar40 = 1;
  }
LAB_001179f6:
  CMutableTransaction::CMutableTransaction(&tx);
  uVar19 = 1;
  if (fCreateBlank == false) {
    if ((int)uVar40 < 2) {
      prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar34,"too few parameters");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar34,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0011de7c;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&strHexTx,argv[1],(allocator<char> *)buf);
    iVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             compare(&strHexTx,"-");
    if (iVar18 == 0) {
      filename._M_dataplus._M_p = (pointer)&filename.field_2;
      filename._M_string_length._0_4_ = 0;
      filename._M_string_length._4_4_ = 0;
      filename.field_2._M_allocated_capacity._0_4_ =
           filename.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      do {
        iVar18 = feof(_stdin);
        if (iVar18 != 0) break;
        sVar24 = fread(buf,1,0x1000,_stdin);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&filename,buf,sVar24);
      } while (0xfff < sVar24);
      iVar18 = ferror(_stdin);
      _Var36 = filename._M_dataplus;
      if (iVar18 != 0) {
        prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar34,"error reading stdin");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar34,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_0011de7c;
      }
      pMVar9 = (MutableTransactionSignatureCreator *)
               CONCAT44(filename._M_string_length._4_4_,(undefined4)filename._M_string_length);
      unaff_R15 = (MutableTransactionSignatureCreator *)0xffffffffffffffff;
      if (pMVar9 != (MutableTransactionSignatureCreator *)0x0) {
        unaff_R15 = (MutableTransactionSignatureCreator *)0x0;
        do {
          pvVar21 = memchr(" \f\n\r\t\v",(int)_Var36._M_p[(long)unaff_R15],6);
          if (pvVar21 == (void *)0x0) goto LAB_0011ad60;
          unaff_R15 = (MutableTransactionSignatureCreator *)
                      ((long)&((_Alloc_hider *)&unaff_R15->super_BaseSignatureCreator)->_M_p + 1);
        } while (pMVar9 != unaff_R15);
        unaff_R15 = (MutableTransactionSignatureCreator *)0xffffffffffffffff;
      }
LAB_0011ad60:
      uVar45 = 0;
      pcVar47 = (pointer)0x0;
      if (unaff_R15 != (MutableTransactionSignatureCreator *)0xffffffffffffffff) {
        pMVar39 = (MutableTransactionSignatureCreator *)0xffffffffffffffff;
        pMVar6 = pMVar9;
        if (pMVar9 != (MutableTransactionSignatureCreator *)0x0) {
          do {
            pMVar39 = (MutableTransactionSignatureCreator *)((long)&pMVar6[-1].m_txdata + 7);
            pvVar21 = memchr(" \f\n\r\t\v",(int)_Var36._M_p[(long)pMVar39],6);
            if (pvVar21 == (void *)0x0) goto LAB_0011adae;
            pMVar6 = pMVar39;
          } while (pMVar39 != (MutableTransactionSignatureCreator *)0x0);
          pMVar39 = (MutableTransactionSignatureCreator *)0xffffffffffffffff;
        }
LAB_0011adae:
        if (pMVar9 < unaff_R15) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",unaff_R15,pMVar9);
LAB_0011ba31:
            prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar34,"invalid TX output pubkey");
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(prVar34,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          goto LAB_0011de7c;
        }
        uVar45 = (long)pMVar39 + (1 - (long)unaff_R15);
        if ((ulong)((long)pMVar9 - (long)unaff_R15) < uVar45) {
          uVar45 = (long)pMVar9 - (long)unaff_R15;
        }
        pcVar47 = _Var36._M_p + (long)unaff_R15;
      }
      valStr._M_dataplus._M_p = (pointer)&valStr.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&valStr,pcVar47,pcVar47 + uVar45);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename._M_dataplus._M_p != &filename.field_2) {
        operator_delete(filename._M_dataplus._M_p,
                        CONCAT26(filename.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(filename.field_2._M_allocated_capacity._4_2_,
                                          filename.field_2._M_allocated_capacity._0_4_)) + 1);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&strHexTx,&valStr);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)valStr._M_dataplus._M_p != &valStr.field_2) {
        operator_delete(valStr._M_dataplus._M_p,
                        CONCAT44(valStr.field_2._M_allocated_capacity._4_4_,
                                 valStr.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    bVar16 = DecodeHexTx(&tx,&strHexTx,true,true);
    if (!bVar16) {
      prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar34,"invalid transaction encoding");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar34,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0011de7c;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)strHexTx._M_dataplus._M_p != &strHexTx.field_2) {
      operator_delete(strHexTx._M_dataplus._M_p,
                      CONCAT44(strHexTx.field_2._M_allocated_capacity._4_4_,
                               strHexTx.field_2._M_allocated_capacity._0_4_) + 1);
    }
    uVar19 = 2;
  }
  if ((int)uVar19 < (int)uVar40) {
    uVar45 = (ulong)uVar19;
    ppuVar53 = &PTR__FillableSigningProvider_003dd858;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&arg,argv[uVar45],(allocator<char> *)buf);
      _Var36 = arg._M_dataplus;
      key._M_dataplus._M_p = (pointer)&key.field_2;
      key._M_string_length = 0;
      key.field_2._M_local_buf[0] = '\0';
      value._M_dataplus._M_p = (pointer)&value.field_2;
      value._M_string_length = 0;
      value.field_2._M_local_buf[0] = '\0';
      if (arg._M_string_length == 0) {
        sVar41 = 0xffffffffffffffff;
      }
      else {
        pvVar21 = memchr(arg._M_dataplus._M_p,0x3d,arg._M_string_length);
        sVar41 = -(ulong)(pvVar21 == (void *)0x0) | (long)pvVar21 - (long)_Var36._M_p;
      }
      if (sVar41 == 0xffffffffffffffff) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&key,&arg);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf,&arg,0,
                   sVar41);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&key,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf);
        if ((char *)buf._0_8_ != buf + 0x10) {
          operator_delete((void *)buf._0_8_,
                          CONCAT17(buf[0x17],CONCAT25(buf._21_2_,CONCAT14(buf[0x14],buf._16_4_))) +
                          1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf,&arg,
                   sVar41 + 1,0xffffffffffffffff);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf);
        if ((char *)buf._0_8_ != buf + 0x10) {
          operator_delete((void *)buf._0_8_,
                          CONCAT17(buf[0x17],CONCAT25(buf._21_2_,CONCAT14(buf[0x14],buf._16_4_))) +
                          1);
        }
      }
      local_15e0._M_head_impl = (ECC_Context *)0x0;
      iVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare(&key,"nversion");
      if (iVar18 == 0) {
        str_01._M_str = value._M_dataplus._M_p;
        str_01._M_len = value._M_string_length;
        bVar16 = ParseUInt32(str_01,(uint32_t *)&strHexTx);
        if (!bVar16 || 2 < (uint32_t)strHexTx._M_dataplus._M_p - 1) {
          prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&filename,"Invalid TX version requested: \'",&value);
          pbVar32 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&filename,"\'");
          buf._0_8_ = (pbVar32->_M_dataplus)._M_p;
          paVar37 = &pbVar32->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)buf._0_8_ == paVar37) {
            uVar4 = *(undefined8 *)paVar37;
            uVar7 = *(undefined8 *)((long)&pbVar32->field_2 + 8);
            buf._16_4_ = (undefined4)uVar4;
            buf[0x14] = (char)((ulong)uVar4 >> 0x20);
            buf._21_2_ = (undefined2)((ulong)uVar4 >> 0x28);
            buf[0x17] = (char)((ulong)uVar4 >> 0x38);
            buf._24_3_ = (undefined3)uVar7;
            buf[0x1b] = (char)((ulong)uVar7 >> 0x18);
            buf._28_4_ = (undefined4)((ulong)uVar7 >> 0x20);
            buf._0_8_ = buf + 0x10;
          }
          else {
            uVar4 = *(undefined8 *)paVar37;
            buf._16_4_ = (undefined4)uVar4;
            buf[0x14] = (char)((ulong)uVar4 >> 0x20);
            buf._21_2_ = (undefined2)((ulong)uVar4 >> 0x28);
            buf[0x17] = (char)((ulong)uVar4 >> 0x38);
          }
          buf._8_8_ = pbVar32->_M_string_length;
          (pbVar32->_M_dataplus)._M_p = (pointer)paVar37;
          pbVar32->_M_string_length = 0;
          (pbVar32->field_2)._M_local_buf[0] = '\0';
          std::runtime_error::runtime_error(prVar34,(string *)buf);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(prVar34,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_0011de7c;
        }
        tx.version = (uint32_t)strHexTx._M_dataplus._M_p;
      }
      else {
        iVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 compare(&key,"locktime");
        if (iVar18 == 0) {
          str_02._M_str = value._M_dataplus._M_p;
          str_02._M_len = value._M_string_length;
          bVar16 = ParseInt64(str_02,(int64_t *)&strHexTx);
          if ((ulong)strHexTx._M_dataplus._M_p >> 0x20 != 0 || !bVar16) {
            prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&filename,"Invalid TX locktime requested: \'",&value);
            pbVar32 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                (&filename,"\'");
            buf._0_8_ = (pbVar32->_M_dataplus)._M_p;
            paVar37 = &pbVar32->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)buf._0_8_ == paVar37) {
              uVar4 = *(undefined8 *)paVar37;
              uVar7 = *(undefined8 *)((long)&pbVar32->field_2 + 8);
              buf._16_4_ = (undefined4)uVar4;
              buf[0x14] = (char)((ulong)uVar4 >> 0x20);
              buf._21_2_ = (undefined2)((ulong)uVar4 >> 0x28);
              buf[0x17] = (char)((ulong)uVar4 >> 0x38);
              buf._24_3_ = (undefined3)uVar7;
              buf[0x1b] = (char)((ulong)uVar7 >> 0x18);
              buf._28_4_ = (undefined4)((ulong)uVar7 >> 0x20);
              buf._0_8_ = buf + 0x10;
            }
            else {
              uVar4 = *(undefined8 *)paVar37;
              buf._16_4_ = (undefined4)uVar4;
              buf[0x14] = (char)((ulong)uVar4 >> 0x20);
              buf._21_2_ = (undefined2)((ulong)uVar4 >> 0x28);
              buf[0x17] = (char)((ulong)uVar4 >> 0x38);
            }
            buf._8_8_ = pbVar32->_M_string_length;
            (pbVar32->_M_dataplus)._M_p = (pointer)paVar37;
            pbVar32->_M_string_length = 0;
            (pbVar32->field_2)._M_local_buf[0] = '\0';
            std::runtime_error::runtime_error(prVar34,(string *)buf);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(prVar34,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_0011de7c;
          }
          tx.nLockTime = (uint32_t)strHexTx._M_dataplus._M_p;
        }
        else {
          iVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   compare(&key,"replaceable");
          if (iVar18 == 0) {
            strHexTx._M_dataplus._M_p = (pointer)0xffffffffffffffff;
            iVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::compare(&value,"");
            if (iVar18 != 0) {
              str_03._M_str = value._M_dataplus._M_p;
              str_03._M_len = value._M_string_length;
              bVar16 = ParseInt64(str_03,(int64_t *)&strHexTx);
              if ((!bVar16 || (long)strHexTx._M_dataplus._M_p < 0) ||
                 (lVar48 = (long)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 3,
                 SBORROW8((long)strHexTx._M_dataplus._M_p,lVar48 * 0x4ec4ec4ec4ec4ec5) ==
                 (long)(strHexTx._M_dataplus._M_p + lVar48 * -0x4ec4ec4ec4ec4ec5) < 0)) {
                prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::operator+(&filename,"Invalid TX input index \'",&value);
                pbVar32 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&filename,"\'");
                buf._0_8_ = (pbVar32->_M_dataplus)._M_p;
                paVar37 = &pbVar32->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)buf._0_8_ == paVar37) {
                  uVar4 = *(undefined8 *)paVar37;
                  uVar7 = *(undefined8 *)((long)&pbVar32->field_2 + 8);
                  buf._16_4_ = (undefined4)uVar4;
                  buf[0x14] = (char)((ulong)uVar4 >> 0x20);
                  buf._21_2_ = (undefined2)((ulong)uVar4 >> 0x28);
                  buf[0x17] = (char)((ulong)uVar4 >> 0x38);
                  buf._24_3_ = (undefined3)uVar7;
                  buf[0x1b] = (char)((ulong)uVar7 >> 0x18);
                  buf._28_4_ = (undefined4)((ulong)uVar7 >> 0x20);
                  buf._0_8_ = buf + 0x10;
                }
                else {
                  uVar4 = *(undefined8 *)paVar37;
                  buf._16_4_ = (undefined4)uVar4;
                  buf[0x14] = (char)((ulong)uVar4 >> 0x20);
                  buf._21_2_ = (undefined2)((ulong)uVar4 >> 0x28);
                  buf[0x17] = (char)((ulong)uVar4 >> 0x38);
                }
                buf._8_8_ = pbVar32->_M_string_length;
                (pbVar32->_M_dataplus)._M_p = (pointer)paVar37;
                pbVar32->_M_string_length = 0;
                (pbVar32->field_2)._M_local_buf[0] = '\0';
                std::runtime_error::runtime_error(prVar34,(string *)buf);
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                goto LAB_0011de7c;
              }
            }
            pCVar11 = tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start !=
                tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              pcVar47 = (pointer)0x0;
              pCVar42 = tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                iVar18 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                   (&value,"");
                if (((iVar18 == 0) || (pcVar47 == strHexTx._M_dataplus._M_p)) &&
                   (0xfffffffd < pCVar42->nSequence)) {
                  pCVar42->nSequence = 0xfffffffd;
                }
                pcVar47 = pcVar47 + 1;
                pCVar42 = pCVar42 + 1;
              } while (pCVar42 != pCVar11);
            }
          }
          else {
            iVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::compare(&key,"delin");
            if (iVar18 == 0) {
              str_04._M_str = value._M_dataplus._M_p;
              str_04._M_len = value._M_string_length;
              bVar16 = ParseInt64(str_04,(int64_t *)&strHexTx);
              if ((!bVar16 || (long)strHexTx._M_dataplus._M_p < 0) ||
                 (lVar48 = (long)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 3,
                 SBORROW8((long)strHexTx._M_dataplus._M_p,lVar48 * 0x4ec4ec4ec4ec4ec5) ==
                 (long)(strHexTx._M_dataplus._M_p + lVar48 * -0x4ec4ec4ec4ec4ec5) < 0)) {
                prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::operator+(&filename,"Invalid TX input index \'",&value);
                pbVar32 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&filename,"\'");
                buf._0_8_ = (pbVar32->_M_dataplus)._M_p;
                paVar37 = &pbVar32->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)buf._0_8_ == paVar37) {
                  uVar4 = *(undefined8 *)paVar37;
                  uVar7 = *(undefined8 *)((long)&pbVar32->field_2 + 8);
                  buf._16_4_ = (undefined4)uVar4;
                  buf[0x14] = (char)((ulong)uVar4 >> 0x20);
                  buf._21_2_ = (undefined2)((ulong)uVar4 >> 0x28);
                  buf[0x17] = (char)((ulong)uVar4 >> 0x38);
                  buf._24_3_ = (undefined3)uVar7;
                  buf[0x1b] = (char)((ulong)uVar7 >> 0x18);
                  buf._28_4_ = (undefined4)((ulong)uVar7 >> 0x20);
                  buf._0_8_ = buf + 0x10;
                }
                else {
                  uVar4 = *(undefined8 *)paVar37;
                  buf._16_4_ = (undefined4)uVar4;
                  buf[0x14] = (char)((ulong)uVar4 >> 0x20);
                  buf._21_2_ = (undefined2)((ulong)uVar4 >> 0x28);
                  buf[0x17] = (char)((ulong)uVar4 >> 0x38);
                }
                buf._8_8_ = pbVar32->_M_string_length;
                (pbVar32->_M_dataplus)._M_p = (pointer)paVar37;
                pbVar32->_M_string_length = 0;
                (pbVar32->field_2)._M_local_buf[0] = '\0';
                std::runtime_error::runtime_error(prVar34,(string *)buf);
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                goto LAB_0011de7c;
              }
              std::vector<CTxIn,_std::allocator<CTxIn>_>::_M_erase
                        (&tx.vin,tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                 super__Vector_impl_data._M_start + (long)strHexTx._M_dataplus._M_p)
              ;
            }
            else {
              iVar18 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                 (&key,"in");
              if (iVar18 == 0) {
                buf._0_8_ = value._M_dataplus._M_p;
                buf[8] = (undefined1)value._M_string_length;
                buf[9] = value._M_string_length._1_1_;
                buf[10] = value._M_string_length._2_1_;
                buf[0xb] = value._M_string_length._3_1_;
                buf[0xc] = value._M_string_length._4_1_;
                buf[0xd] = value._M_string_length._5_1_;
                buf[0xe] = value._M_string_length._6_1_;
                buf[0xf] = value._M_string_length._7_1_;
                strHexTx._M_dataplus._M_p._0_1_ = 0x3a;
                separators._M_str = (char *)in_R8;
                separators._M_len = (size_t)&strHexTx;
                util::Split<std::__cxx11::string>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&valStr,(util *)buf,(Span<const_char> *)0x1,separators);
                str._M_str = (char *)(valStr._M_string_length - (long)valStr._M_dataplus._M_p);
                if (str._M_str < (char *)0x21) {
                  prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar34,"TX input missing separator");
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  goto LAB_0011de7c;
                }
                str._M_len = *(size_t *)valStr._M_dataplus._M_p;
                detail::FromHex<uint256>
                          ((optional<uint256> *)buf,*(detail **)(valStr._M_dataplus._M_p + 8),str);
                _Var36 = valStr._M_dataplus;
                if (buf[0x20] != '\x01') {
                  prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar34,"invalid TX input txid");
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  goto LAB_0011de7c;
                }
                uVar8 = CONCAT25(buf._21_2_,CONCAT14(buf[0x14],buf._16_4_));
                filename.field_2._8_4_ = CONCAT13(buf[0x1b],buf._24_3_);
                filename.field_2._0_1_ = buf[0x10];
                filename.field_2._1_1_ = buf[0x11];
                filename.field_2._2_1_ = buf[0x12];
                filename.field_2._3_1_ = buf[0x13];
                filename.field_2._M_allocated_capacity._4_2_ = (undefined2)((uint7)uVar8 >> 0x20);
                filename.field_2._M_allocated_capacity._6_2_ =
                     (undefined2)(CONCAT17(buf[0x17],uVar8) >> 0x30);
                filename.field_2._12_1_ = buf[0x1c];
                filename.field_2._13_1_ = buf[0x1d];
                filename.field_2._14_1_ = buf[0x1e];
                filename.field_2._15_1_ = buf[0x1f];
                filename._M_dataplus._M_p = (pointer)buf._0_8_;
                filename._M_string_length._0_4_ = (undefined4)buf._8_8_;
                filename._M_string_length._4_4_ = SUB84(buf._8_8_,4);
                str_05._M_str = *(char **)(valStr._M_dataplus._M_p + 0x20);
                str_05._M_len = *(size_t *)(valStr._M_dataplus._M_p + 0x28);
                bVar16 = ParseInt64(str_05,(int64_t *)&prevtxsObj);
                _Var15 = valStr._M_dataplus;
                if (!bVar16 || 0x1b207 < (ulong)prevtxsObj._0_8_) {
                  unaff_R15 = (MutableTransactionSignatureCreator *)__cxa_allocate_exception(0x10);
                  std::operator+(&strHexTx,"invalid TX input vout \'",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(_Var36._M_p + 0x20));
                  pbVar32 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            append(&strHexTx,"\'");
                  auVar10._8_8_ = buf + 0x10;
                  auVar10._0_8_ = pbVar32;
                  pcVar47 = (pbVar32->_M_dataplus)._M_p;
                  auVar52._8_8_ = pcVar47;
                  auVar52._0_8_ = pbVar32;
                  _Var36._M_p = (pointer)&pbVar32->field_2;
                  if (pcVar47 == _Var36._M_p) {
                    uVar4 = *(undefined8 *)_Var36._M_p;
                    uVar7 = *(undefined8 *)((long)&pbVar32->field_2 + 8);
                    buf._16_4_ = (undefined4)uVar4;
                    buf[0x14] = (char)((ulong)uVar4 >> 0x20);
                    buf._21_2_ = (undefined2)((ulong)uVar4 >> 0x28);
                    buf[0x17] = (char)((ulong)uVar4 >> 0x38);
                    buf._24_3_ = (undefined3)uVar7;
                    buf[0x1b] = (char)((ulong)uVar7 >> 0x18);
                    buf._28_4_ = (undefined4)((ulong)uVar7 >> 0x20);
                  }
                  else {
LAB_0011bd42:
                    uVar4 = *(undefined8 *)_Var36._M_p;
                    buf._16_4_ = (undefined4)uVar4;
                    buf[0x14] = (char)((ulong)uVar4 >> 0x20);
                    buf._21_2_ = (undefined2)((ulong)uVar4 >> 0x28);
                    buf[0x17] = (char)((ulong)uVar4 >> 0x38);
                    auVar10 = auVar52;
                  }
                  buf._0_8_ = auVar10._8_8_;
                  puVar33 = auVar10._0_8_;
                  buf._8_8_ = puVar33[1];
                  *puVar33 = _Var36._M_p;
                  puVar33[1] = 0;
                  *(undefined1 *)(puVar33 + 2) = 0;
                  std::runtime_error::runtime_error((runtime_error *)unaff_R15,(string *)buf);
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    __cxa_throw(unaff_R15,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  goto LAB_0011de7c;
                }
                if (0x40 < valStr._M_string_length - (long)valStr._M_dataplus._M_p) {
                  buf._0_8_ = buf + 0x10;
                  strHexTx._M_dataplus._M_p = (pointer)0x16;
                  buf._0_8_ = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)buf,(size_type *)&strHexTx,0);
                  buf._16_4_ = SUB84(strHexTx._M_dataplus._M_p,0);
                  buf[0x14] = (char)((ulong)strHexTx._M_dataplus._M_p >> 0x20);
                  buf._21_2_ = (undefined2)((ulong)strHexTx._M_dataplus._M_p >> 0x28);
                  buf[0x17] = (char)((ulong)strHexTx._M_dataplus._M_p >> 0x38);
                  builtin_strncpy((char *)buf._0_8_,"invalid TX sequence id",0x16);
                  buf._8_8_ = strHexTx._M_dataplus._M_p;
                  *(buf._0_8_ + strHexTx._M_dataplus._M_p) = '\0';
                  TrimAndParse<unsigned_int>((string *)(_Var15._M_p + 0x40),(string *)buf);
                  if ((char *)buf._0_8_ != buf + 0x10) {
                    operator_delete((void *)buf._0_8_,
                                    CONCAT17(buf[0x17],
                                             CONCAT25(buf._21_2_,CONCAT14(buf[0x14],buf._16_4_))) +
                                    1);
                  }
                }
                strHexTx._M_dataplus._M_p = (pointer)0x0;
                strHexTx._M_string_length._0_4_ = 0;
                strHexTx._M_string_length._4_4_ = 0;
                strHexTx.field_2._M_allocated_capacity._0_4_ = 0;
                strHexTx.field_2._M_allocated_capacity._4_4_ = 0;
                strHexTx.field_2._8_4_ = 0;
                strHexTx.field_2._12_4_ = 0;
                in_stack_ffffffffffffe990 =
                     CONCAT44(filename._M_string_length._4_4_,(undefined4)filename._M_string_length)
                ;
                in_stack_ffffffffffffe998 =
                     CONCAT26(filename.field_2._M_allocated_capacity._6_2_,
                              CONCAT24(filename.field_2._M_allocated_capacity._4_2_,
                                       filename.field_2._M_allocated_capacity._0_4_));
                in_stack_ffffffffffffe9a0 = CONCAT44(filename.field_2._12_4_,filename.field_2._8_4_)
                ;
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
                     (char)(undefined4)filename._M_string_length;
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
                     (char)((uint)(undefined4)filename._M_string_length >> 8);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
                     (char)((uint)(undefined4)filename._M_string_length >> 0x10);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
                     (char)((uint)(undefined4)filename._M_string_length >> 0x18);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
                     (char)filename._M_string_length._4_4_;
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
                     (char)((uint)filename._M_string_length._4_4_ >> 8);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
                     (char)((uint)filename._M_string_length._4_4_ >> 0x10);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
                     (char)((uint)filename._M_string_length._4_4_ >> 0x18);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
                     filename._M_dataplus._M_p;
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
                     (char)filename.field_2._0_4_;
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
                     (char)((uint)filename.field_2._0_4_ >> 8);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
                     (char)((uint)filename.field_2._0_4_ >> 0x10);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
                     (char)((uint)filename.field_2._0_4_ >> 0x18);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
                     (char)filename.field_2._4_2_;
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
                     (char)((ushort)filename.field_2._4_2_ >> 8);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
                     (char)filename.field_2._6_2_;
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
                     (char)((ushort)filename.field_2._6_2_ >> 8);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
                     (char)filename.field_2._8_4_;
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
                     (char)((uint)filename.field_2._8_4_ >> 8);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
                     (char)((uint)filename.field_2._8_4_ >> 0x10);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
                     (char)((uint)filename.field_2._8_4_ >> 0x18);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
                     (char)filename.field_2._12_4_;
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
                     (char)((uint)filename.field_2._12_4_ >> 8);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
                     (char)((uint)filename.field_2._12_4_ >> 0x10);
                hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
                     (char)((uint)filename.field_2._12_4_ >> 0x18);
                scriptSigIn.super_CScriptBase._union._12_4_ = in_stack_ffffffffffffe9b4;
                scriptSigIn.super_CScriptBase._union._0_8_ = (char *)in_stack_ffffffffffffe9a8._0_8_
                ;
                scriptSigIn.super_CScriptBase._union._8_4_ = in_stack_ffffffffffffe9a8._8_4_;
                scriptSigIn.super_CScriptBase._union._16_8_ = ppuVar53;
                scriptSigIn.super_CScriptBase._union._24_4_ = in_stack_ffffffffffffe9c0;
                scriptSigIn.super_CScriptBase._size = in_stack_ffffffffffffe9c4;
                in_stack_ffffffffffffe988._M_p = filename._M_dataplus._M_p;
                CTxIn::CTxIn((CTxIn *)buf,hashPrevTx,prevtxsObj.typ,scriptSigIn,(uint32_t)&strHexTx)
                ;
                if (0x1c < (uint)strHexTx.field_2._12_4_) {
                  free(strHexTx._M_dataplus._M_p);
                  strHexTx._M_dataplus._M_p = (pointer)0x0;
                }
                std::vector<CTxIn,_std::allocator<CTxIn>_>::push_back(&tx.vin,(CTxIn *)buf);
                std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)(buf + 0x50));
                if (0x1c < (uint)buf._68_4_) {
                  free((void *)buf._40_8_);
                  buf[0x28] = '\0';
                  buf[0x29] = '\0';
                  buf[0x2a] = '\0';
                  buf[0x2b] = '\0';
                  buf[0x2c] = '\0';
                  buf[0x2d] = '\0';
                  buf[0x2e] = '\0';
                  buf[0x2f] = '\0';
                }
                pUVar27 = (UniValue *)&valStr;
              }
              else {
                iVar18 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                   (&key,"delout");
                if (iVar18 == 0) {
                  str_06._M_str = value._M_dataplus._M_p;
                  str_06._M_len = value._M_string_length;
                  bVar16 = ParseInt64(str_06,(int64_t *)&strHexTx);
                  if ((bVar16 && -1 < (long)strHexTx._M_dataplus._M_p) &&
                     (lVar48 = (long)tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3,
                     SBORROW8((long)strHexTx._M_dataplus._M_p,lVar48 * -0x3333333333333333) !=
                     (long)(strHexTx._M_dataplus._M_p + lVar48 * 0x3333333333333333) < 0)) {
                    std::vector<CTxOut,_std::allocator<CTxOut>_>::_M_erase
                              (&tx.vout,tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                        _M_impl.super__Vector_impl_data._M_start +
                                        (long)strHexTx._M_dataplus._M_p);
                    goto LAB_00119106;
                  }
                  prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::operator+(&filename,"Invalid TX output index \'",&value);
                  pbVar32 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            append(&filename,"\'");
                  buf._0_8_ = (pbVar32->_M_dataplus)._M_p;
                  paVar37 = &pbVar32->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)buf._0_8_ == paVar37) {
                    uVar4 = *(undefined8 *)paVar37;
                    uVar7 = *(undefined8 *)((long)&pbVar32->field_2 + 8);
                    buf._16_4_ = (undefined4)uVar4;
                    buf[0x14] = (char)((ulong)uVar4 >> 0x20);
                    buf._21_2_ = (undefined2)((ulong)uVar4 >> 0x28);
                    buf[0x17] = (char)((ulong)uVar4 >> 0x38);
                    buf._24_3_ = (undefined3)uVar7;
                    buf[0x1b] = (char)((ulong)uVar7 >> 0x18);
                    buf._28_4_ = (undefined4)((ulong)uVar7 >> 0x20);
                    buf._0_8_ = buf + 0x10;
                  }
                  else {
                    uVar4 = *(undefined8 *)paVar37;
                    buf._16_4_ = (undefined4)uVar4;
                    buf[0x14] = (char)((ulong)uVar4 >> 0x20);
                    buf._21_2_ = (undefined2)((ulong)uVar4 >> 0x28);
                    buf[0x17] = (char)((ulong)uVar4 >> 0x38);
                  }
                  buf._8_8_ = pbVar32->_M_string_length;
                  (pbVar32->_M_dataplus)._M_p = (pointer)paVar37;
                  pbVar32->_M_string_length = 0;
                  (pbVar32->field_2)._M_local_buf[0] = '\0';
                  std::runtime_error::runtime_error(prVar34,(string *)buf);
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  goto LAB_0011de7c;
                }
                iVar18 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                   (&key,"outaddr");
                if (iVar18 == 0) {
                  buf._0_8_ = value._M_dataplus._M_p;
                  buf[8] = (undefined1)value._M_string_length;
                  buf[9] = value._M_string_length._1_1_;
                  buf[10] = value._M_string_length._2_1_;
                  buf[0xb] = value._M_string_length._3_1_;
                  buf[0xc] = value._M_string_length._4_1_;
                  buf[0xd] = value._M_string_length._5_1_;
                  buf[0xe] = value._M_string_length._6_1_;
                  buf[0xf] = value._M_string_length._7_1_;
                  strHexTx._M_dataplus._M_p._0_1_ = 0x3a;
                  separators_00._M_str = (char *)in_R8;
                  separators_00._M_len = (size_t)&strHexTx;
                  util::Split<std::__cxx11::string>
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&mergedTx,(util *)buf,(Span<const_char> *)0x1,separators_00);
                  if ((long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start != 0x40) {
                    prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error
                              (prVar34,"TX output missing or too many separators");
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    goto LAB_0011de7c;
                  }
                  types._M_t._M_impl._0_8_ =
                       ExtractAndValidateValue
                                 ((string *)
                                  mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                  strHexTx._M_dataplus._M_p = (pointer)&strHexTx.field_2;
                  lVar48 = *(long *)&((mergedTx.vin.
                                       super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                       super__Vector_impl_data._M_start)->prevout).n;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&strHexTx,lVar48,
                             ((mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start)->scriptSig).
                             super_CScriptBase._union.indirect_contents.indirect + lVar48);
                  DecodeDestination((CTxDestination *)buf,&strHexTx);
                  bVar16 = IsValidDestination((CTxDestination *)buf);
                  if (!bVar16) {
                    prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar34,"invalid TX output address");
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    goto LAB_0011de7c;
                  }
                  GetScriptForDestination((CScript *)&valStr,(CTxDestination *)buf);
                  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&prevtxsObj,
                             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&valStr);
                  scriptPubKeyIn.super_CScriptBase._union._8_8_ = in_stack_ffffffffffffe990;
                  scriptPubKeyIn.super_CScriptBase._union.indirect_contents.indirect =
                       in_stack_ffffffffffffe988._M_p;
                  scriptPubKeyIn.super_CScriptBase._union._16_8_ = in_stack_ffffffffffffe998;
                  scriptPubKeyIn.super_CScriptBase._24_8_ = in_stack_ffffffffffffe9a0;
                  CTxOut::CTxOut((CTxOut *)&filename,(CAmount *)&types,scriptPubKeyIn);
                  if (0x1c < (uint)prevtxsObj.val.field_2._M_allocated_capacity._4_4_) {
                    free((void *)prevtxsObj._0_8_);
                    prevtxsObj.typ = VNULL;
                    prevtxsObj._4_4_ = 0;
                  }
                  std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back
                            (&tx.vout,(value_type *)&filename);
                  if (0x1c < CONCAT13(local_1e1,CONCAT21(local_1e3,uStack_1e4))) {
                    free((void *)filename._M_string_length);
                    filename._M_string_length = 0;
                  }
                  if (0x1c < CONCAT13(valStr.field_2._M_local_buf[0xf],
                                      CONCAT21(valStr.field_2._13_2_,
                                               valStr.field_2._M_local_buf[0xc]))) {
                    free(valStr._M_dataplus._M_p);
                    valStr._M_dataplus._M_p = (pointer)0x0;
                  }
                  std::__detail::__variant::
                  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                       *)buf);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)strHexTx._M_dataplus._M_p != &strHexTx.field_2) {
                    lVar48 = CONCAT44(strHexTx.field_2._M_allocated_capacity._4_4_,
                                      strHexTx.field_2._M_allocated_capacity._0_4_);
                    _Var36 = strHexTx._M_dataplus;
LAB_001183ed:
                    uVar46 = lVar48 + 1;
LAB_001190f4:
                    operator_delete(_Var36._M_p,uVar46);
                  }
                }
                else {
                  iVar18 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           compare(&key,"outpubkey");
                  if (iVar18 == 0) {
                    pEVar22 = (ECC_Context *)operator_new(1);
                    ECC_Context::ECC_Context(pEVar22);
                    _Var12._M_head_impl = local_15e0._M_head_impl;
                    bVar16 = local_15e0._M_head_impl != (ECC_Context *)0x0;
                    local_15e0._M_head_impl = pEVar22;
                    if (bVar16) {
                      ECC_Context::~ECC_Context(_Var12._M_head_impl);
                      operator_delete(_Var12._M_head_impl,1);
                    }
                    buf._0_8_ = value._M_dataplus._M_p;
                    buf[8] = (undefined1)value._M_string_length;
                    buf[9] = value._M_string_length._1_1_;
                    buf[10] = value._M_string_length._2_1_;
                    buf[0xb] = value._M_string_length._3_1_;
                    buf[0xc] = value._M_string_length._4_1_;
                    buf[0xd] = value._M_string_length._5_1_;
                    buf[0xe] = value._M_string_length._6_1_;
                    buf[0xf] = value._M_string_length._7_1_;
                    strHexTx._M_dataplus._M_p._0_1_ = 0x3a;
                    separators_01._M_str = (char *)in_R8;
                    separators_01._M_len = (size_t)&strHexTx;
                    util::Split<std::__cxx11::string>
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&prevtxsObj,(util *)buf,(Span<const_char> *)0x1,separators_01);
                    if (((long)prevtxsObj.val._M_dataplus._M_p - prevtxsObj._0_8_ &
                        0xffffffffffffffc0U) == 0x40) {
                      mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start =
                           (pointer)ExtractAndValidateValue((string *)prevtxsObj._0_8_);
                      hex_str._M_str = *(char **)(prevtxsObj._0_8_ + 0x20);
                      hex_str._M_len = *(size_t *)(prevtxsObj._0_8_ + 0x28);
                      ParseHex<unsigned_char>
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)buf,
                                 hex_str);
                      CPubKey::Set<unsigned_char_const*>
                                ((CPubKey *)&filename,(uchar *)buf._0_8_,(uchar *)buf._8_8_);
                      if (buf._0_8_ != 0) {
                        operator_delete((void *)buf._0_8_,
                                        CONCAT17(buf[0x17],
                                                 CONCAT25(buf._21_2_,CONCAT14(buf[0x14],buf._16_4_))
                                                ) - buf._0_8_);
                      }
                      bVar16 = CPubKey::IsFullyValid((CPubKey *)&filename);
                      if (!bVar16) goto LAB_0011ba31;
                      GetScriptForRawPubKey((CScript *)&strHexTx,(CPubKey *)&filename);
                      if ((long)prevtxsObj.val._M_dataplus._M_p - prevtxsObj._0_8_ == 0x60) {
                        buf._0_8_ = buf + 0x10;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)buf,*(long *)(prevtxsObj._0_8_ + 0x40),
                                   *(long *)(prevtxsObj._0_8_ + 0x48) +
                                   *(long *)(prevtxsObj._0_8_ + 0x40));
                        uVar7 = buf._8_8_;
                        uVar4 = buf._0_8_;
                        if (buf._8_8_ == 0) {
                          bVar17 = false;
                          bVar16 = false;
                        }
                        else {
                          pvVar21 = memchr((void *)buf._0_8_,0x57,buf._8_8_);
                          uVar13 = buf._0_8_;
                          bVar17 = (long)pvVar21 - uVar4 != -1 && pvVar21 != (void *)0x0;
                          pvVar21 = memchr((void *)buf._0_8_,0x53,uVar7);
                          bVar16 = (long)pvVar21 - uVar13 != -1 && pvVar21 != (void *)0x0;
                        }
                        if ((char *)buf._0_8_ != buf + 0x10) {
                          operator_delete((void *)buf._0_8_,
                                          CONCAT17(buf[0x17],
                                                   CONCAT25(buf._21_2_,
                                                            CONCAT14(buf[0x14],buf._16_4_))) + 1);
                        }
                      }
                      else {
                        bVar17 = false;
                        bVar16 = false;
                      }
                      if (bVar17) {
                        if (((byte)filename._M_dataplus._M_p & 0xfe) != 2) {
                          prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    (prVar34,
                                     "Uncompressed pubkeys are not useable for SegWit outputs");
                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                            __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          goto LAB_0011de7c;
                        }
                        WitnessV0KeyHash::WitnessV0KeyHash
                                  ((WitnessV0KeyHash *)&types,(CPubKey *)&filename);
                        buf[0x10] = (char)types._M_t._M_impl.super__Rb_tree_header._M_header.
                                          _M_parent;
                        buf[0x11] = types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
                                    _1_1_;
                        buf[0x12] = types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
                                    _2_1_;
                        buf[0x13] = types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
                                    _3_1_;
                        buf[0] = types._M_t._M_impl._0_1_;
                        buf[1] = types._M_t._M_impl._1_1_;
                        buf[2] = types._M_t._M_impl._2_1_;
                        buf[3] = types._M_t._M_impl._3_1_;
                        buf[4] = types._M_t._M_impl._4_1_;
                        buf[5] = types._M_t._M_impl._5_1_;
                        buf[6] = types._M_t._M_impl._6_1_;
                        buf[7] = types._M_t._M_impl._7_1_;
                        buf._8_8_ = types._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
                        buf[0x48] = '\x05';
                        GetScriptForDestination((CScript *)&valStr,(CTxDestination *)buf);
                        if (0x1c < (uint)strHexTx.field_2._12_4_) {
                          free(strHexTx._M_dataplus._M_p);
                        }
                        strHexTx.field_2._M_allocated_capacity._0_4_ =
                             valStr.field_2._M_allocated_capacity._0_4_;
                        strHexTx.field_2._M_allocated_capacity._4_4_ =
                             valStr.field_2._M_allocated_capacity._4_4_;
                        strHexTx.field_2._8_4_ = valStr.field_2._8_4_;
                        strHexTx._M_dataplus = valStr._M_dataplus;
                        strHexTx.field_2._12_4_ =
                             CONCAT13(valStr.field_2._M_local_buf[0xf],
                                      CONCAT21(valStr.field_2._13_2_,
                                               valStr.field_2._M_local_buf[0xc]));
                        valStr.field_2._M_local_buf[0xc] = '\0';
                        valStr.field_2._13_2_ = 0;
                        valStr.field_2._M_local_buf[0xf] = '\0';
                        strHexTx._M_string_length = valStr._M_string_length;
                        std::__detail::__variant::
                        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                             *)buf);
                      }
                      if (bVar16) {
                        ScriptHash::ScriptHash((ScriptHash *)&types,(CScript *)&strHexTx);
                        buf[0x10] = (char)types._M_t._M_impl.super__Rb_tree_header._M_header.
                                          _M_parent;
                        buf[0x11] = types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
                                    _1_1_;
                        buf[0x12] = types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
                                    _2_1_;
                        buf[0x13] = types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
                                    _3_1_;
                        buf[0] = types._M_t._M_impl._0_1_;
                        buf[1] = types._M_t._M_impl._1_1_;
                        buf[2] = types._M_t._M_impl._2_1_;
                        buf[3] = types._M_t._M_impl._3_1_;
                        buf[4] = types._M_t._M_impl._4_1_;
                        buf[5] = types._M_t._M_impl._5_1_;
                        buf[6] = types._M_t._M_impl._6_1_;
                        buf[7] = types._M_t._M_impl._7_1_;
                        buf._8_8_ = types._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
                        buf[0x48] = '\x03';
                        GetScriptForDestination((CScript *)&valStr,(CTxDestination *)buf);
                        if (0x1c < (uint)strHexTx.field_2._12_4_) {
                          free(strHexTx._M_dataplus._M_p);
                        }
                        strHexTx.field_2._M_allocated_capacity._0_4_ =
                             valStr.field_2._M_allocated_capacity._0_4_;
                        strHexTx.field_2._M_allocated_capacity._4_4_ =
                             valStr.field_2._M_allocated_capacity._4_4_;
                        strHexTx.field_2._8_4_ = valStr.field_2._8_4_;
                        strHexTx._M_dataplus = valStr._M_dataplus;
                        strHexTx.field_2._12_4_ =
                             CONCAT13(valStr.field_2._M_local_buf[0xf],
                                      CONCAT21(valStr.field_2._13_2_,
                                               valStr.field_2._M_local_buf[0xc]));
                        valStr.field_2._M_local_buf[0xc] = '\0';
                        valStr.field_2._13_2_ = 0;
                        valStr.field_2._M_local_buf[0xf] = '\0';
                        strHexTx._M_string_length = valStr._M_string_length;
                        std::__detail::__variant::
                        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                             *)buf);
                      }
                      prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&valStr,
                                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&strHexTx);
                      scriptPubKeyIn_00.super_CScriptBase._union._8_8_ = in_stack_ffffffffffffe990;
                      scriptPubKeyIn_00.super_CScriptBase._union.indirect_contents.indirect =
                           in_stack_ffffffffffffe988._M_p;
                      scriptPubKeyIn_00.super_CScriptBase._union._16_8_ = in_stack_ffffffffffffe998;
                      scriptPubKeyIn_00.super_CScriptBase._24_8_ = in_stack_ffffffffffffe9a0;
                      CTxOut::CTxOut((CTxOut *)buf,(CAmount *)&mergedTx,scriptPubKeyIn_00);
                      if (0x1c < CONCAT13(valStr.field_2._M_local_buf[0xf],
                                          CONCAT21(valStr.field_2._13_2_,
                                                   valStr.field_2._M_local_buf[0xc]))) {
                        free(valStr._M_dataplus._M_p);
                        valStr._M_dataplus._M_p = (pointer)0x0;
                      }
                      std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back
                                (&tx.vout,(value_type *)buf);
                      if (0x1c < (uint)buf._36_4_) {
                        free((void *)buf._8_8_);
                        buf[8] = '\0';
                        buf[9] = '\0';
                        buf[10] = '\0';
                        buf[0xb] = '\0';
                        buf[0xc] = '\0';
                        buf[0xd] = '\0';
                        buf[0xe] = '\0';
                        buf[0xf] = '\0';
                      }
                      if (0x1c < (uint)strHexTx.field_2._12_4_) {
                        free(strHexTx._M_dataplus._M_p);
                        strHexTx._M_dataplus._M_p = (pointer)0x0;
                      }
                      pUVar27 = &prevtxsObj;
                      goto LAB_00119101;
                    }
                    prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error
                              (prVar34,"TX output missing or too many separators");
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    goto LAB_0011de7c;
                  }
                  iVar18 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           compare(&key,"outmultisig");
                  if (iVar18 == 0) {
                    pEVar22 = (ECC_Context *)operator_new(1);
                    ECC_Context::ECC_Context(pEVar22);
                    _Var12._M_head_impl = local_15e0._M_head_impl;
                    bVar16 = local_15e0._M_head_impl != (ECC_Context *)0x0;
                    local_15e0._M_head_impl = pEVar22;
                    if (bVar16) {
                      ECC_Context::~ECC_Context(_Var12._M_head_impl);
                      operator_delete(_Var12._M_head_impl,1);
                    }
                    buf._0_8_ = value._M_dataplus._M_p;
                    buf[8] = (undefined1)value._M_string_length;
                    buf[9] = value._M_string_length._1_1_;
                    buf[10] = value._M_string_length._2_1_;
                    buf[0xb] = value._M_string_length._3_1_;
                    buf[0xc] = value._M_string_length._4_1_;
                    buf[0xd] = value._M_string_length._5_1_;
                    buf[0xe] = value._M_string_length._6_1_;
                    buf[0xf] = value._M_string_length._7_1_;
                    strHexTx._M_dataplus._M_p._0_1_ = 0x3a;
                    separators_02._M_str = (char *)in_R8;
                    separators_02._M_len = (size_t)&strHexTx;
                    util::Split<std::__cxx11::string>
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&mergedTx,(util *)buf,(Span<const_char> *)0x1,separators_02);
                    if ((ulong)((long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_start) < 0x41) {
                      prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(prVar34,"Not enough multisig parameters");
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      goto LAB_0011de7c;
                    }
                    txv.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         (pointer)ExtractAndValidateValue
                                            ((string *)
                                             mergedTx.vin.
                                             super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                             _M_impl.super__Vector_impl_data._M_start);
                    pCVar11 = mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                              .super__Vector_impl_data._M_start;
                    if ((ulong)((long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 2) {
                      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0011de7c;
                      std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,1);
                    }
                    else {
                      buf._0_8_ = buf + 0x10;
                      strHexTx._M_dataplus._M_p = &DAT_00000020;
                      buf._0_8_ = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::_M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)buf,(size_type *)&strHexTx,0);
                      buf._16_4_ = SUB84(strHexTx._M_dataplus._M_p,0);
                      buf[0x14] = (char)((ulong)strHexTx._M_dataplus._M_p >> 0x20);
                      buf._21_2_ = (undefined2)((ulong)strHexTx._M_dataplus._M_p >> 0x28);
                      buf[0x17] = (char)((ulong)strHexTx._M_dataplus._M_p >> 0x38);
                      builtin_strncpy((char *)buf._0_8_,"invalid multisig required number",0x20);
                      buf._8_8_ = strHexTx._M_dataplus._M_p;
                      *(buf._0_8_ + strHexTx._M_dataplus._M_p) = '\0';
                      _Var36 = strHexTx._M_dataplus;
                      uVar19 = TrimAndParse<unsigned_int>
                                         ((string *)&(pCVar11->prevout).n,(string *)buf);
                      if ((char *)buf._0_8_ != buf + 0x10) {
                        operator_delete((void *)buf._0_8_,
                                        CONCAT17(buf[0x17],
                                                 CONCAT25(buf._21_2_,CONCAT14(buf[0x14],buf._16_4_))
                                                ) + 1);
                      }
                      pCVar11 = mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = (char)uVar19;
                      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
                           (char)(uVar19 >> 8);
                      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
                           (char)(uVar19 >> 0x10);
                      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
                           (char)(uVar19 >> 0x18);
                      if ((ulong)((long)mergedTx.vin.
                                        super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                  (long)mergedTx.vin.
                                        super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                        super__Vector_impl_data._M_start >> 5) < 3) {
                        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                          auVar52 = std::__throw_out_of_range_fmt
                                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                               ,2);
                          goto LAB_0011bd42;
                        }
                        goto LAB_0011de7c;
                      }
                      buf._0_8_ = buf + 0x10;
                      strHexTx._M_dataplus._M_p = (pointer)0x1d;
                      buf._0_8_ = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::_M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)buf,(size_type *)&strHexTx,0);
                      buf._16_4_ = SUB84(strHexTx._M_dataplus._M_p,0);
                      buf[0x14] = (char)((ulong)strHexTx._M_dataplus._M_p >> 0x20);
                      buf._21_2_ = (undefined2)((ulong)strHexTx._M_dataplus._M_p >> 0x28);
                      buf[0x17] = (char)((ulong)strHexTx._M_dataplus._M_p >> 0x38);
                      builtin_strncpy((char *)buf._0_8_,"invalid multisig total number",0x1d);
                      buf._8_8_ = strHexTx._M_dataplus._M_p;
                      *(buf._0_8_ + strHexTx._M_dataplus._M_p) = '\0';
                      uVar19 = TrimAndParse<unsigned_int>
                                         ((string *)
                                          ((long)&(pCVar11->scriptSig).super_CScriptBase._union +
                                          0x18),(string *)buf);
                      if ((char *)buf._0_8_ != buf + 0x10) {
                        operator_delete((void *)buf._0_8_,
                                        CONCAT17(buf[0x17],
                                                 CONCAT25(buf._21_2_,CONCAT14(buf[0x14],buf._16_4_))
                                                ) + 1);
                      }
                      numkeys = uVar19;
                      if ((ulong)((long)mergedTx.vin.
                                        super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                  (long)mergedTx.vin.
                                        super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                        super__Vector_impl_data._M_start >> 5) < (ulong)(uVar19 + 3)
                         ) {
                        prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  (prVar34,"incorrect number of multisig pubkeys");
                        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                          __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        goto LAB_0011de7c;
                      }
                      if ((((uint)out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_4_ <=
                            uVar19) && (0xffffffeb < uVar19 - 0x15)) &&
                         (0xffffffeb <
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_4_ - 0x15)) {
                        prevtxsObj.typ = VNULL;
                        prevtxsObj._4_4_ = 0;
                        prevtxsObj.val._M_dataplus._M_p = (pointer)0x0;
                        prevtxsObj.val._M_string_length = 0;
                        if (0 < (int)uVar19) {
                          lVar51 = 0x68;
                          lVar48 = 0;
                          do {
                            hex_str_00._M_str =
                                 *(char **)(((mergedTx.vin.
                                              super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->prevout).
                                            hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                                           lVar51 + -8);
                            hex_str_00._M_len =
                                 *(size_t *)
                                  (((mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->prevout).hash.
                                   m_wrapped.super_base_blob<256U>.m_data._M_elems + lVar51);
                            ParseHex<unsigned_char>
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &filename,hex_str_00);
                            CPubKey::Set<unsigned_char_const*>
                                      ((CPubKey *)buf,(uchar *)filename._M_dataplus._M_p,
                                       (uchar *)filename._M_string_length);
                            if (filename._M_dataplus._M_p != (pointer)0x0) {
                              operator_delete(filename._M_dataplus._M_p,
                                              CONCAT26(filename.field_2._M_allocated_capacity._6_2_,
                                                       CONCAT24(filename.field_2.
                                                                _M_allocated_capacity._4_2_,
                                                                filename.field_2.
                                                                _M_allocated_capacity._0_4_)) -
                                              (long)filename._M_dataplus._M_p);
                            }
                            bVar16 = CPubKey::IsFullyValid((CPubKey *)buf);
                            _Var36 = prevtxsObj.val._M_dataplus;
                            if (!bVar16) {
                              prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error(prVar34,"invalid TX output pubkey");
                              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              goto LAB_0011de7c;
                            }
                            if (prevtxsObj.val._M_dataplus._M_p ==
                                (pointer)prevtxsObj.val._M_string_length) {
                              std::vector<CPubKey,std::allocator<CPubKey>>::
                              _M_realloc_insert<CPubKey_const&>
                                        ((vector<CPubKey,std::allocator<CPubKey>> *)&prevtxsObj,
                                         (iterator)prevtxsObj.val._M_dataplus._M_p,(CPubKey *)buf);
                            }
                            else {
                              memcpy(prevtxsObj.val._M_dataplus._M_p,(CTxIn *)buf,0x41);
                              prevtxsObj.val._M_dataplus._M_p = _Var36._M_p + 0x41;
                            }
                            lVar48 = lVar48 + 1;
                            lVar51 = lVar51 + 0x20;
                            uVar19 = numkeys;
                          } while (lVar48 < (int)numkeys);
                        }
                        uVar46 = (long)mergedTx.vin.
                                       super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                 (long)mergedTx.vin.
                                       super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                       super__Vector_impl_data._M_start >> 5;
                        if (uVar46 == uVar19 + 4) {
                          buf._0_8_ = buf + 0x10;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)buf,
                                     *(long *)&mergedTx.vin.
                                               super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                               _M_impl.super__Vector_impl_data._M_finish[-1].
                                               nSequence,
                                     (long)&((mergedTx.vin.
                                              super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                              _M_impl.super__Vector_impl_data._M_finish[-1].
                                              scriptWitness.stack.
                                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            )._M_impl +
                                     *(long *)&mergedTx.vin.
                                               super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                               _M_impl.super__Vector_impl_data._M_finish[-1].
                                               nSequence);
                          uVar7 = buf._8_8_;
                          uVar4 = buf._0_8_;
                          if (buf._8_8_ == 0) {
                            bVar17 = false;
                            bVar16 = false;
                          }
                          else {
                            pvVar21 = memchr((void *)buf._0_8_,0x57,buf._8_8_);
                            uVar13 = buf._0_8_;
                            bVar17 = (long)pvVar21 - uVar4 != -1 && pvVar21 != (void *)0x0;
                            pvVar21 = memchr((void *)buf._0_8_,0x53,uVar7);
                            bVar16 = (long)pvVar21 - uVar13 != -1 && pvVar21 != (void *)0x0;
                          }
                          if ((char *)buf._0_8_ != buf + 0x10) {
                            operator_delete((void *)buf._0_8_,
                                            CONCAT17(buf[0x17],
                                                     CONCAT25(buf._21_2_,
                                                              CONCAT14(buf[0x14],buf._16_4_))) + 1);
                          }
                        }
                        else {
                          if (uVar19 + 4 < uVar46) {
                            prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error(prVar34,"Too many parameters");
                            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                              __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            goto LAB_0011de7c;
                          }
                          bVar17 = false;
                          bVar16 = false;
                        }
                        GetScriptForMultisig
                                  ((CScript *)&filename,
                                   out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_4_,
                                   (vector<CPubKey,_std::allocator<CPubKey>_> *)&prevtxsObj);
                        pbVar23 = (byte *)prevtxsObj._0_8_;
                        if (bVar17) {
                          for (; pbVar23 != (byte *)prevtxsObj.val._M_dataplus._M_p;
                              pbVar23 = pbVar23 + 0x41) {
                            if ((*pbVar23 & 0xfe) != 2) {
                              prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        (prVar34,
                                         "Uncompressed pubkeys are not useable for SegWit outputs");
                              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              goto LAB_0011de7c;
                            }
                          }
                          WitnessV0ScriptHash::WitnessV0ScriptHash
                                    ((WitnessV0ScriptHash *)&valStr,(CScript *)&filename);
                          buf._8_8_ = valStr._M_string_length;
                          buf[0x10] = valStr.field_2._0_1_;
                          buf[0x11] = valStr.field_2._1_1_;
                          buf[0x12] = valStr.field_2._2_1_;
                          buf[0x13] = valStr.field_2._3_1_;
                          buf[0x14] = (char)valStr.field_2._M_allocated_capacity._4_4_;
                          buf._21_2_ = (undefined2)((uint)valStr.field_2._4_4_ >> 8);
                          buf._24_3_ = (undefined3)valStr.field_2._8_4_;
                          buf[0x17] = (char)((uint)valStr.field_2._4_4_ >> 0x18);
                          buf[0x1b] = (char)((uint)valStr.field_2._8_4_ >> 0x18);
                          buf._28_4_ = (undefined4)
                                       (CONCAT17(valStr.field_2._M_local_buf[0xf],
                                                 CONCAT25(valStr.field_2._13_2_,
                                                          CONCAT14(valStr.field_2._M_local_buf[0xc],
                                                                   valStr.field_2._8_4_))) >> 0x20);
                          buf._0_8_ = valStr._M_dataplus._M_p;
                          buf[0x48] = '\x04';
                          GetScriptForDestination((CScript *)&strHexTx,(CTxDestination *)buf);
                          if (0x1c < (uint)filename.field_2._12_4_) {
                            free(filename._M_dataplus._M_p);
                          }
                          filename.field_2._M_allocated_capacity._0_4_ =
                               strHexTx.field_2._M_allocated_capacity._0_4_;
                          filename.field_2._M_allocated_capacity._4_2_ =
                               (undefined2)strHexTx.field_2._M_allocated_capacity._4_4_;
                          filename.field_2._M_allocated_capacity._6_2_ =
                               (undefined2)((uint)strHexTx.field_2._4_4_ >> 0x10);
                          filename.field_2._8_4_ = strHexTx.field_2._8_4_;
                          filename._M_dataplus = strHexTx._M_dataplus;
                          filename.field_2._12_4_ = strHexTx.field_2._12_4_;
                          strHexTx.field_2._12_4_ = 0;
                          filename._M_string_length = strHexTx._M_string_length;
                          std::__detail::__variant::
                          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                               *)buf);
                        }
                        if (bVar16) {
                          if (0x225 < (uint)filename.field_2._12_4_) {
                            prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                            uVar5 = filename.field_2._12_4_ + -0x1d;
                            if ((uint)filename.field_2._12_4_ < 0x1d) {
                              uVar5 = filename.field_2._12_4_;
                            }
                            strHexTx._M_dataplus._M_p._0_4_ = uVar5;
                            tinyformat::format<unsigned_int,unsigned_int>
                                      ((string *)buf,
                                       (tinyformat *)"redeemScript exceeds size limit: %d > %d",
                                       (char *)&strHexTx,&MAX_SCRIPT_ELEMENT_SIZE,(uint *)in_R8);
                            std::runtime_error::runtime_error(prVar34,(string *)buf);
                            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                              __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            goto LAB_0011de7c;
                          }
                          ScriptHash::ScriptHash((ScriptHash *)&valStr,(CScript *)&filename);
                          buf[0x10] = valStr.field_2._0_1_;
                          buf[0x11] = valStr.field_2._1_1_;
                          buf[0x12] = valStr.field_2._2_1_;
                          buf[0x13] = valStr.field_2._3_1_;
                          buf._8_8_ = valStr._M_string_length;
                          buf._0_8_ = valStr._M_dataplus._M_p;
                          buf[0x48] = '\x03';
                          GetScriptForDestination((CScript *)&strHexTx,(CTxDestination *)buf);
                          if (0x1c < (uint)filename.field_2._12_4_) {
                            free(filename._M_dataplus._M_p);
                          }
                          filename.field_2._M_allocated_capacity._0_4_ =
                               strHexTx.field_2._M_allocated_capacity._0_4_;
                          filename.field_2._M_allocated_capacity._4_2_ =
                               (undefined2)strHexTx.field_2._M_allocated_capacity._4_4_;
                          filename.field_2._M_allocated_capacity._6_2_ =
                               (undefined2)((uint)strHexTx.field_2._4_4_ >> 0x10);
                          filename.field_2._8_4_ = strHexTx.field_2._8_4_;
                          filename._M_dataplus = strHexTx._M_dataplus;
                          filename.field_2._12_4_ = strHexTx.field_2._12_4_;
                          strHexTx.field_2._12_4_ = 0;
                          filename._M_string_length = strHexTx._M_string_length;
                          std::__detail::__variant::
                          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                               *)buf);
                        }
                        prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&strHexTx,
                                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&filename);
                        scriptPubKeyIn_01.super_CScriptBase._union._8_8_ = in_stack_ffffffffffffe990
                        ;
                        scriptPubKeyIn_01.super_CScriptBase._union.indirect_contents.indirect =
                             in_stack_ffffffffffffe988._M_p;
                        scriptPubKeyIn_01.super_CScriptBase._union._16_8_ =
                             in_stack_ffffffffffffe998;
                        scriptPubKeyIn_01.super_CScriptBase._24_8_ = in_stack_ffffffffffffe9a0;
                        CTxOut::CTxOut((CTxOut *)buf,(CAmount *)&txv,scriptPubKeyIn_01);
                        if (0x1c < (uint)strHexTx.field_2._12_4_) {
                          free(strHexTx._M_dataplus._M_p);
                          strHexTx._M_dataplus._M_p = (pointer)0x0;
                        }
                        std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back
                                  (&tx.vout,(value_type *)buf);
                        if (0x1c < (uint)buf._36_4_) {
                          free((void *)buf._8_8_);
                          buf[8] = '\0';
                          buf[9] = '\0';
                          buf[10] = '\0';
                          buf[0xb] = '\0';
                          buf[0xc] = '\0';
                          buf[0xd] = '\0';
                          buf[0xe] = '\0';
                          buf[0xf] = '\0';
                        }
                        if (0x1c < (uint)filename.field_2._12_4_) {
                          free(filename._M_dataplus._M_p);
                          filename._M_dataplus._M_p = (pointer)0x0;
                        }
                        if (prevtxsObj._0_8_ == 0) goto LAB_001190f9;
                        uVar46 = prevtxsObj.val._M_string_length - prevtxsObj._0_8_;
                        _Var36._M_p = (pointer)prevtxsObj._0_8_;
                        goto LAB_001190f4;
                      }
                    }
                    prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                    util::ToString<unsigned_int>((string *)&prevtxsObj,(uint *)&out);
                    std::operator+(&valStr,"multisig parameter mismatch. Required ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&prevtxsObj);
                    pbVar32 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              append(&valStr," of ");
                    strHexTx._M_dataplus._M_p = (pbVar32->_M_dataplus)._M_p;
                    paVar37 = &pbVar32->field_2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)strHexTx._M_dataplus._M_p == paVar37) {
                      uVar4 = *(undefined8 *)((long)&pbVar32->field_2 + 8);
                      strHexTx.field_2._M_allocated_capacity._0_4_ =
                           (undefined4)*(undefined8 *)paVar37;
                      strHexTx.field_2._M_allocated_capacity._4_4_ =
                           (undefined4)((ulong)*(undefined8 *)paVar37 >> 0x20);
                      strHexTx.field_2._8_4_ = (undefined4)uVar4;
                      strHexTx.field_2._12_4_ = (undefined4)((ulong)uVar4 >> 0x20);
                      strHexTx._M_dataplus._M_p = (pointer)&strHexTx.field_2;
                    }
                    else {
                      strHexTx.field_2._M_allocated_capacity._0_4_ =
                           (undefined4)*(undefined8 *)paVar37;
                      strHexTx.field_2._M_allocated_capacity._4_4_ =
                           (undefined4)((ulong)*(undefined8 *)paVar37 >> 0x20);
                    }
                    strHexTx._M_string_length._0_4_ = (undefined4)pbVar32->_M_string_length;
                    strHexTx._M_string_length._4_4_ =
                         (undefined4)(pbVar32->_M_string_length >> 0x20);
                    (pbVar32->_M_dataplus)._M_p = (pointer)paVar37;
                    pbVar32->_M_string_length = 0;
                    (pbVar32->field_2)._M_local_buf[0] = '\0';
                    util::ToString<unsigned_int>((string *)&types,&numkeys);
                    std::operator+(&filename,&strHexTx,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&types);
                    pbVar32 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              append(&filename,"signatures.");
                    buf._0_8_ = (pbVar32->_M_dataplus)._M_p;
                    paVar37 = &pbVar32->field_2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)buf._0_8_ == paVar37) {
                      uVar4 = *(undefined8 *)paVar37;
                      uVar7 = *(undefined8 *)((long)&pbVar32->field_2 + 8);
                      buf._16_4_ = (undefined4)uVar4;
                      buf[0x14] = (char)((ulong)uVar4 >> 0x20);
                      buf._21_2_ = (undefined2)((ulong)uVar4 >> 0x28);
                      buf[0x17] = (char)((ulong)uVar4 >> 0x38);
                      buf._24_3_ = (undefined3)uVar7;
                      buf[0x1b] = (char)((ulong)uVar7 >> 0x18);
                      buf._28_4_ = (undefined4)((ulong)uVar7 >> 0x20);
                      buf._0_8_ = buf + 0x10;
                    }
                    else {
                      uVar4 = *(undefined8 *)paVar37;
                      buf._16_4_ = (undefined4)uVar4;
                      buf[0x14] = (char)((ulong)uVar4 >> 0x20);
                      buf._21_2_ = (undefined2)((ulong)uVar4 >> 0x28);
                      buf[0x17] = (char)((ulong)uVar4 >> 0x38);
                    }
                    buf._8_8_ = pbVar32->_M_string_length;
                    (pbVar32->_M_dataplus)._M_p = (pointer)paVar37;
                    pbVar32->_M_string_length = 0;
                    (pbVar32->field_2)._M_local_buf[0] = '\0';
                    std::runtime_error::runtime_error(prVar34,(string *)buf);
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    goto LAB_0011de7c;
                  }
                  iVar18 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           compare(&key,"outscript");
                  if (iVar18 != 0) {
                    iVar18 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             compare(&key,"outdata");
                    _Var36 = value._M_dataplus;
                    if (iVar18 == 0) {
                      mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start = (pointer)0x0;
                      if (value._M_string_length == 0) {
                        sVar41 = 0xffffffffffffffff;
                      }
                      else {
                        pvVar21 = memchr(value._M_dataplus._M_p,0x3a,value._M_string_length);
                        sVar41 = -(ulong)(pvVar21 == (void *)0x0) |
                                 (long)pvVar21 - (long)_Var36._M_p;
                      }
                      if (sVar41 == 0xffffffffffffffff) {
                        sVar41 = 0;
                      }
                      else {
                        if (sVar41 == 0) {
                          prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(prVar34,"TX output value not specified")
                          ;
                          goto LAB_0011c27c;
                        }
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)buf,&value,0,sVar41);
                        mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start =
                             (pointer)ExtractAndValidateValue((string *)buf);
                        if ((char *)buf._0_8_ != buf + 0x10) {
                          operator_delete((void *)buf._0_8_,
                                          CONCAT17(buf[0x17],
                                                   CONCAT25(buf._21_2_,
                                                            CONCAT14(buf[0x14],buf._16_4_))) + 1);
                        }
                        sVar41 = sVar41 + 1;
                      }
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                                (&strHexTx,&value,sVar41,0xffffffffffffffff);
                      str_07._M_str = strHexTx._M_dataplus._M_p;
                      str_07._M_len = strHexTx._M_string_length;
                      bVar16 = IsHex(str_07);
                      if (bVar16) {
                        hex_str_01._M_str = strHexTx._M_dataplus._M_p;
                        hex_str_01._M_len = strHexTx._M_string_length;
                        ParseHex<unsigned_char>
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &prevtxsObj,hex_str_01);
                        filename.field_2._M_allocated_capacity._0_4_ = 0;
                        filename.field_2._M_allocated_capacity._4_2_ = 0;
                        filename.field_2._M_allocated_capacity._6_2_ = 0;
                        filename.field_2._8_4_ = 0;
                        filename.field_2._12_4_ = 0;
                        filename._M_dataplus._M_p = (pointer)0x0;
                        filename._M_string_length._0_4_ = 0;
                        filename._M_string_length._4_4_ = 0;
                        valStr._M_dataplus._M_p._0_1_ = 0x6a;
                        prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&filename,
                                   (iterator)&filename,(uchar *)&valStr);
                        other = &CScript::operator<<((CScript *)&filename,
                                                     (
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&prevtxsObj)->super_CScriptBase;
                        prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&valStr,other
                                  );
                        scriptPubKeyIn_02.super_CScriptBase._union._8_8_ = in_stack_ffffffffffffe990
                        ;
                        scriptPubKeyIn_02.super_CScriptBase._union.indirect_contents.indirect =
                             in_stack_ffffffffffffe988._M_p;
                        scriptPubKeyIn_02.super_CScriptBase._union._16_8_ =
                             in_stack_ffffffffffffe998;
                        scriptPubKeyIn_02.super_CScriptBase._24_8_ = in_stack_ffffffffffffe9a0;
                        CTxOut::CTxOut((CTxOut *)buf,(CAmount *)&mergedTx,scriptPubKeyIn_02);
                        if (0x1c < CONCAT13(valStr.field_2._M_local_buf[0xf],
                                            CONCAT21(valStr.field_2._13_2_,
                                                     valStr.field_2._M_local_buf[0xc]))) {
                          free(valStr._M_dataplus._M_p);
                          valStr._M_dataplus._M_p = (pointer)0x0;
                        }
                        if (0x1c < (uint)filename.field_2._12_4_) {
                          free(filename._M_dataplus._M_p);
                          filename._M_dataplus._M_p = (pointer)0x0;
                        }
                        std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back
                                  (&tx.vout,(value_type *)buf);
                        if (0x1c < (uint)buf._36_4_) {
                          free((void *)buf._8_8_);
                          buf[8] = '\0';
                          buf[9] = '\0';
                          buf[10] = '\0';
                          buf[0xb] = '\0';
                          buf[0xc] = '\0';
                          buf[0xd] = '\0';
                          buf[0xe] = '\0';
                          buf[0xf] = '\0';
                        }
                        if (prevtxsObj._0_8_ != 0) {
                          uVar46 = prevtxsObj.val._M_string_length - prevtxsObj._0_8_;
                          _Var36._M_p = (pointer)prevtxsObj._0_8_;
LAB_0011989d:
                          operator_delete(_Var36._M_p,uVar46);
                        }
LAB_001198a2:
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)strHexTx._M_dataplus._M_p == &strHexTx.field_2) goto LAB_00119106;
                        lVar48 = CONCAT44(strHexTx.field_2._M_allocated_capacity._4_4_,
                                          strHexTx.field_2._M_allocated_capacity._0_4_);
                        _Var36._M_p = strHexTx._M_dataplus._M_p;
LAB_001198c3:
                        operator_delete(_Var36._M_p,lVar48 + 1);
                        goto LAB_00119106;
                      }
                      prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(prVar34,"invalid TX output data");
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                    }
                    else {
                      iVar18 = std::__cxx11::
                               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                               compare(&key,"sign");
                      if (iVar18 == 0) {
                        pEVar22 = (ECC_Context *)operator_new(1);
                        ECC_Context::ECC_Context(pEVar22);
                        _Var12._M_head_impl = local_15e0._M_head_impl;
                        bVar16 = local_15e0._M_head_impl != (ECC_Context *)0x0;
                        local_15e0._M_head_impl = pEVar22;
                        if (bVar16) {
                          ECC_Context::~ECC_Context(_Var12._M_head_impl);
                          operator_delete(_Var12._M_head_impl,1);
                        }
                        if (value._M_string_length == 0) {
                          in_stack_ffffffffffffe9b4 = 1;
                        }
                        else {
                          iVar18 = std::__cxx11::
                                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   ::compare(&value,"DEFAULT");
                          if (iVar18 == 0) {
                            bVar16 = true;
                            paVar43 = sighashOptions;
                          }
                          else {
                            uVar46 = 0xffffffffffffffff;
                            paVar43 = sighashOptions;
                            do {
                              if (uVar46 == 5) {
                                in_stack_ffffffffffffe9b4 = 0;
                                bVar16 = false;
                                goto LAB_001198ec;
                              }
                              paVar1 = paVar43 + 1;
                              paVar43 = paVar43 + 1;
                              iVar18 = std::__cxx11::
                                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       ::compare(&value,paVar1->flagStr);
                              uVar46 = uVar46 + 1;
                            } while (iVar18 != 0);
                            bVar16 = uVar46 < 6;
                          }
                          in_stack_ffffffffffffe9b4 = paVar43->flags;
LAB_001198ec:
                          if (!bVar16) {
                            prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      (prVar34,"unknown sighash flag/sign option");
                            goto LAB_0011c27c;
                          }
                        }
                        std::vector<CTxIn,_std::allocator<CTxIn>_>::vector(&mergedTx.vin,&tx.vin);
                        std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
                                  (&mergedTx.vout,&tx.vout);
                        mergedTx.version = tx.version;
                        mergedTx.nLockTime = tx.nLockTime;
                        std::vector<CTxIn,_std::allocator<CTxIn>_>::vector(&txv.vin,&tx.vin);
                        std::vector<CTxOut,_std::allocator<CTxOut>_>::vector(&txv.vout,&tx.vout);
                        txv.version = tx.version;
                        txv.nLockTime = tx.nLockTime;
                        viewDummy._vptr_CCoinsView = (_func_int **)&PTR_GetCoin_003dc1e8;
                        CCoinsViewCache::CCoinsViewCache
                                  ((CCoinsViewCache *)&filename,&viewDummy,false);
                        buf[0x10] = 'p';
                        buf[0x11] = 'r';
                        buf[0x12] = 'i';
                        buf[0x13] = 'v';
                        buf[0x14] = 'a';
                        buf[0x15] = 't';
                        buf[0x16] = 'e';
                        buf[0x17] = 'k';
                        buf[0x18] = 'e';
                        buf[0x19] = 'y';
                        buf[0x1a] = 's';
                        buf[8] = '\v';
                        buf[9] = '\0';
                        buf[10] = '\0';
                        buf[0xb] = '\0';
                        buf[0xc] = '\0';
                        buf[0xd] = '\0';
                        buf[0xe] = '\0';
                        buf[0xf] = '\0';
                        buf[0x1b] = '\0';
                        buf._0_8_ = buf + 0x10;
                        cVar25 = std::
                                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                                 ::find(&registers_abi_cxx11_._M_t,(key_type *)buf);
                        if ((char *)buf._0_8_ != buf + 0x10) {
                          operator_delete((void *)buf._0_8_,
                                          CONCAT17(buf[0x17],
                                                   CONCAT25(buf._21_2_,
                                                            CONCAT14(buf[0x14],buf._16_4_))) + 1);
                        }
                        if ((_Rb_tree_header *)cVar25._M_node ==
                            &registers_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
                          prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    (prVar34,"privatekeys register variable must be set.");
                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                            __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                        }
                        else {
                          strHexTx.field_2._M_allocated_capacity._0_4_ = 0;
                          strHexTx.field_2._8_4_ = 0;
                          strHexTx.field_2._12_4_ = 0;
                          local_260._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                          local_260._M_impl.super__Rb_tree_header._M_header._M_parent =
                               (_Base_ptr)0x0;
                          local_260._M_impl.super__Rb_tree_header._M_header._M_left =
                               &local_260._M_impl.super__Rb_tree_header._M_header;
                          _Stack_230.__data.__list.__prev = (__pthread_internal_list *)0x0;
                          _Stack_230.__data.__list.__next = (__pthread_internal_list *)0x0;
                          _Stack_230._8_8_ = 0;
                          local_260._M_impl.super__Rb_tree_header._M_node_count = 0;
                          _Stack_230.__align = 0;
                          _Stack_230._16_8_ = 1;
                          buf._0_8_ = buf + 0x10;
                          buf[0x10] = 'p';
                          buf[0x11] = 'r';
                          buf[0x12] = 'i';
                          buf[0x13] = 'v';
                          buf[0x14] = 'a';
                          buf[0x15] = 't';
                          buf[0x16] = 'e';
                          buf[0x17] = 'k';
                          buf[0x18] = 'e';
                          buf[0x19] = 'y';
                          buf[0x1a] = 's';
                          buf[8] = '\v';
                          buf[9] = '\0';
                          buf[10] = '\0';
                          buf[0xb] = '\0';
                          buf[0xc] = '\0';
                          buf[0xd] = '\0';
                          buf[0xe] = '\0';
                          buf[0xf] = '\0';
                          buf[0x1b] = '\0';
                          strHexTx._M_dataplus._M_p = (pointer)ppuVar53;
                          local_260._M_impl.super__Rb_tree_header._M_header._M_right =
                               local_260._M_impl.super__Rb_tree_header._M_header._M_left;
                          pmVar26 = std::
                                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                                    ::operator[](&registers_abi_cxx11_,(key_type *)buf);
                          valStr._M_dataplus._M_p._0_4_ = pmVar26->typ;
                          valStr._M_string_length = (long)&valStr.field_2 + 8;
                          pcVar47 = (pmVar26->val)._M_dataplus._M_p;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&valStr._M_string_length,pcVar47,
                                     pcVar47 + (pmVar26->val)._M_string_length);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::vector(&local_2c8,&pmVar26->keys);
                          std::vector<UniValue,_std::allocator<UniValue>_>::vector
                                    (&local_2b0,&pmVar26->values);
                          if ((char *)buf._0_8_ != buf + 0x10) {
                            operator_delete((void *)buf._0_8_,
                                            CONCAT17(buf[0x17],
                                                     CONCAT25(buf._21_2_,
                                                              CONCAT14(buf[0x14],buf._16_4_))) + 1);
                          }
                          if (local_2b0.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                              _M_impl.super__Vector_impl_data._M_finish !=
                              local_2b0.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                              _M_impl.super__Vector_impl_data._M_start) {
                            sVar44 = 0;
                            uVar46 = 1;
                            do {
                              pUVar27 = UniValue::operator[]((UniValue *)&valStr,sVar44);
                              if (pUVar27->typ != VSTR) {
                                prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          (prVar34,"privatekey not a std::string");
                                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                  __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                              std::runtime_error::~runtime_error);
                                }
                                goto LAB_0011de7c;
                              }
                              UniValue::operator[]((UniValue *)&valStr,sVar44);
                              DecodeSecret((string *)&prevtxsObj);
                              if (prevtxsObj.val._M_dataplus._M_p == (pointer)0x0) {
                                prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error(prVar34,"privatekey not valid");
                                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                  __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                              std::runtime_error::~runtime_error);
                                }
                                goto LAB_0011de7c;
                              }
                              CKey::GetPubKey((CPubKey *)buf,(CKey *)&prevtxsObj);
                              (**(code **)(strHexTx._M_dataplus._M_p + 0x50))
                                        (&strHexTx,&prevtxsObj,(CTxIn *)buf);
                              if (prevtxsObj.val._M_dataplus._M_p != (pointer)0x0) {
                                SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                                          ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)
                                           &prevtxsObj.val,
                                           (array<unsigned_char,_32UL> *)
                                           prevtxsObj.val._M_dataplus._M_p);
                              }
                              uVar28 = ((long)local_2b0.
                                              super__Vector_base<UniValue,_std::allocator<UniValue>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_2b0.
                                              super__Vector_base<UniValue,_std::allocator<UniValue>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                       0x2e8ba2e8ba2e8ba3;
                              bVar16 = uVar46 <= uVar28;
                              lVar48 = uVar28 - uVar46;
                              sVar44 = uVar46;
                              uVar46 = (ulong)((int)uVar46 + 1);
                            } while (bVar16 && lVar48 != 0);
                          }
                          builtin_strncpy(buf + 0x10,"prevtxs",7);
                          buf[8] = '\a';
                          buf[9] = '\0';
                          buf[10] = '\0';
                          buf[0xb] = '\0';
                          buf[0xc] = '\0';
                          buf[0xd] = '\0';
                          buf[0xe] = '\0';
                          buf[0xf] = '\0';
                          buf._23_4_ = buf._23_4_ & 0xffffff00;
                          buf._0_8_ = buf + 0x10;
                          cVar25 = std::
                                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                                   ::find(&registers_abi_cxx11_._M_t,(key_type *)buf);
                          if ((char *)buf._0_8_ != buf + 0x10) {
                            operator_delete((void *)buf._0_8_,
                                            CONCAT17(buf[0x17],
                                                     CONCAT25(buf._21_2_,
                                                              CONCAT14(buf[0x14],buf._16_4_))) + 1);
                          }
                          if ((_Rb_tree_header *)cVar25._M_node !=
                              &registers_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
                            buf._0_8_ = buf + 0x10;
                            builtin_strncpy(buf + 0x10,"prevtxs",7);
                            buf[8] = '\a';
                            buf[9] = '\0';
                            buf[10] = '\0';
                            buf[0xb] = '\0';
                            buf[0xc] = '\0';
                            buf[0xd] = '\0';
                            buf[0xe] = '\0';
                            buf[0xf] = '\0';
                            buf._23_4_ = buf._23_4_ & 0xffffff00;
                            pmVar26 = std::
                                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                                      ::operator[](&registers_abi_cxx11_,(key_type *)buf);
                            prevtxsObj.typ = pmVar26->typ;
                            prevtxsObj.val._M_dataplus._M_p = (pointer)&prevtxsObj.val.field_2;
                            pcVar47 = (pmVar26->val)._M_dataplus._M_p;
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)&prevtxsObj.val,pcVar47,
                                       pcVar47 + (pmVar26->val)._M_string_length);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::vector(&prevtxsObj.keys,&pmVar26->keys);
                            std::vector<UniValue,_std::allocator<UniValue>_>::vector
                                      (&prevtxsObj.values,&pmVar26->values);
                            if ((char *)buf._0_8_ != buf + 0x10) {
                              operator_delete((void *)buf._0_8_,
                                              CONCAT17(buf[0x17],
                                                       CONCAT25(buf._21_2_,
                                                                CONCAT14(buf[0x14],buf._16_4_))) + 1
                                             );
                            }
                            if (prevtxsObj.values.
                                super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                super__Vector_impl_data._M_finish !=
                                prevtxsObj.values.
                                super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                super__Vector_impl_data._M_start) {
                              sVar44 = 0;
                              do {
                                pUVar27 = UniValue::operator[](&prevtxsObj,sVar44);
                                if (pUVar27->typ != VOBJ) {
                                  prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            (prVar34,"expected prevtxs internal object");
                                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                    __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                                std::runtime_error::~runtime_error);
                                  }
                                  goto LAB_0011de7c;
                                }
                                buf._0_8_ = buf + 0x10;
                                buf[0x10] = 't';
                                buf[0x11] = 'x';
                                buf[0x12] = 'i';
                                buf[0x13] = 'd';
                                buf[8] = '\x04';
                                buf[9] = '\0';
                                buf[10] = '\0';
                                buf[0xb] = '\0';
                                buf[0xc] = '\0';
                                buf[0xd] = '\0';
                                buf[0xe] = '\0';
                                buf[0xf] = '\0';
                                buf[0x14] = '\0';
                                buf[0x20] = '\x03';
                                buf[0x21] = '\0';
                                buf[0x22] = '\0';
                                buf[0x23] = '\0';
                                buf._40_8_ = buf + 0x38;
                                buf[0x38] = 'v';
                                buf[0x39] = 'o';
                                buf[0x3a] = 'u';
                                buf[0x3b] = 't';
                                buf[0x30] = '\x04';
                                buf[0x31] = '\0';
                                buf[0x32] = '\0';
                                buf[0x33] = '\0';
                                buf[0x34] = '\0';
                                buf[0x35] = '\0';
                                buf[0x36] = '\0';
                                buf[0x37] = '\0';
                                buf[0x3c] = '\0';
                                buf[0x48] = '\x04';
                                buf[0x49] = '\0';
                                buf[0x4a] = '\0';
                                buf[0x4b] = '\0';
                                plVar50 = (long *)(buf + 0x60);
                                buf[0x60] = 's';
                                buf[0x61] = 'c';
                                buf[0x62] = 'r';
                                buf[99] = 'i';
                                buf[100] = 'p';
                                buf[0x65] = 't';
                                buf[0x66] = 'P';
                                buf[0x67] = 'u';
                                buf[0x68] = 'b';
                                buf[0x69] = 'K';
                                buf[0x6a] = 'e';
                                buf[0x6b] = 'y';
                                buf[0x58] = '\f';
                                buf[0x59] = '\0';
                                buf[0x5a] = '\0';
                                buf[0x5b] = '\0';
                                buf[0x5c] = '\0';
                                buf[0x5d] = '\0';
                                buf[0x5e] = '\0';
                                buf[0x5f] = '\0';
                                buf._108_4_ = buf._108_4_ & 0xffffff00;
                                buf[0x70] = '\x03';
                                buf[0x71] = '\0';
                                buf[0x72] = '\0';
                                buf[0x73] = '\0';
                                __comp = &out;
                                in_R8 = (allocator_type *)&numkeys;
                                __l._M_len = 3;
                                __l._M_array = (iterator)buf;
                                buf._80_8_ = plVar50;
                                std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>_>_>
                                ::map(&types,__l,
                                      (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)__comp,in_R8);
                                lVar48 = -0x78;
                                do {
                                  if (plVar50 != (long *)plVar50[-2]) {
                                    operator_delete((long *)plVar50[-2],*plVar50 + 1);
                                  }
                                  plVar50 = plVar50 + -5;
                                  lVar48 = lVar48 + 0x28;
                                } while (lVar48 != 0);
                                bVar16 = UniValue::checkObject(pUVar27,&types);
                                if (!bVar16) {
                                  prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            (prVar34,"prevtxs internal object typecheck fail");
                                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                    __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                                std::runtime_error::~runtime_error);
                                  }
                                  goto LAB_0011de7c;
                                }
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
                                     out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                                ;
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\x04'
                                ;
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0'
                                ;
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0'
                                ;
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0'
                                ;
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0'
                                ;
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0'
                                ;
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = 't'
                                ;
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = 'x'
                                ;
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = 'i'
                                ;
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = 'd'
                                ;
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
                                     '\0';
                                pUVar29 = UniValue::operator[](pUVar27,(string *)&out);
                                psVar30 = UniValue::get_str_abi_cxx11_(pUVar29);
                                str_00._M_str = (char *)__comp;
                                str_00._M_len = (size_t)(psVar30->_M_dataplus)._M_p;
                                detail::FromHex<uint256>
                                          ((optional<uint256> *)buf,
                                           (detail *)psVar30->_M_string_length,str_00);
                                uVar5 = buf._23_4_;
                                cVar14 = buf[0x20];
                                if (buf[0x20] == '\x01') {
                                  local_358[4] = buf[0x14];
                                  local_358[0] = buf[0x10];
                                  local_358[1] = buf[0x11];
                                  local_358[2] = buf[0x12];
                                  local_358[3] = buf[0x13];
                                  local_358[5] = buf[0x15];
                                  local_358[6] = buf[0x16];
                                  local_358[7] = buf[0x17];
                                  auStack_350[3] = buf[0x1b];
                                  auStack_350[0] = buf[0x18];
                                  auStack_350[1] = buf[0x19];
                                  auStack_350[2] = buf[0x1a];
                                  auStack_350[4] = buf[0x1c];
                                  auStack_350[5] = buf[0x1d];
                                  auStack_350[6] = buf[0x1e];
                                  auStack_350[7] = buf[0x1f];
                                  numkeys._0_1_ = buf[0];
                                  numkeys._1_1_ = buf[1];
                                  numkeys._2_1_ = buf[2];
                                  numkeys._3_1_ = buf[3];
                                  cStack_364 = buf[4];
                                  cStack_363 = buf[5];
                                  cStack_362 = buf[6];
                                  cStack_361 = buf[7];
                                  acStack_360[0] = buf[8];
                                  acStack_360[1] = buf[9];
                                  acStack_360[2] = buf[10];
                                  acStack_360[3] = buf[0xb];
                                  acStack_360[4] = buf[0xc];
                                  acStack_360[5] = buf[0xd];
                                  acStack_360[6] = buf[0xe];
                                  acStack_360[7] = buf[0xf];
                                }
                                buf._23_4_ = uVar5;
                                if ((uchar *)out.hash.m_wrapped.super_base_blob<256U>.m_data.
                                             _M_elems._0_8_ !=
                                    out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10)
                                {
                                  operator_delete((void *)out.hash.m_wrapped.super_base_blob<256U>.
                                                          m_data._M_elems._0_8_,
                                                  out.hash.m_wrapped.super_base_blob<256U>.m_data.
                                                  _M_elems._16_8_ + 1);
                                }
                                if (cVar14 == '\0') {
                                  prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                                  scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
                                       (char *)((long)&scriptPubKey.super_CScriptBase._union + 0x10)
                                  ;
                                  scriptPubKey.super_CScriptBase._union._8_8_ = 4;
                                  scriptPubKey.super_CScriptBase._union._16_5_ = 0x64697874;
                                  pUVar27 = UniValue::operator[](pUVar27,(string *)&scriptPubKey);
                                  psVar30 = UniValue::get_str_abi_cxx11_(pUVar27);
                                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&out,"txid must be hexadecimal string (not \'",
                                                 psVar30);
                                  pbVar32 = std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            ::append((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&out,"\')");
                                  buf._0_8_ = (pbVar32->_M_dataplus)._M_p;
                                  paVar37 = &pbVar32->field_2;
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)buf._0_8_ == paVar37) {
                                    uVar4 = *(undefined8 *)paVar37;
                                    uVar7 = *(undefined8 *)((long)&pbVar32->field_2 + 8);
                                    buf._16_4_ = (undefined4)uVar4;
                                    buf[0x14] = (char)((ulong)uVar4 >> 0x20);
                                    buf._21_2_ = (undefined2)((ulong)uVar4 >> 0x28);
                                    buf[0x17] = (char)((ulong)uVar4 >> 0x38);
                                    buf._24_3_ = (undefined3)uVar7;
                                    buf[0x1b] = (char)((ulong)uVar7 >> 0x18);
                                    buf._28_4_ = (undefined4)((ulong)uVar7 >> 0x20);
                                    buf._0_8_ = buf + 0x10;
                                  }
                                  else {
                                    uVar4 = *(undefined8 *)paVar37;
                                    buf._16_4_ = (undefined4)uVar4;
                                    buf[0x14] = (char)((ulong)uVar4 >> 0x20);
                                    buf._21_2_ = (undefined2)((ulong)uVar4 >> 0x28);
                                    buf[0x17] = (char)((ulong)uVar4 >> 0x38);
                                  }
                                  buf._8_8_ = pbVar32->_M_string_length;
                                  (pbVar32->_M_dataplus)._M_p = (pointer)paVar37;
                                  pbVar32->_M_string_length = 0;
                                  (pbVar32->field_2)._M_local_buf[0] = '\0';
                                  std::runtime_error::runtime_error(prVar34,(string *)buf);
                                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                    __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                                std::runtime_error::~runtime_error);
                                  }
                                  goto LAB_0011de7c;
                                }
                                buf._0_8_ = buf + 0x10;
                                builtin_strncpy(buf + 0x10,"vout",5);
                                buf[8] = '\x04';
                                buf[9] = '\0';
                                buf[10] = '\0';
                                buf[0xb] = '\0';
                                buf[0xc] = '\0';
                                buf[0xd] = '\0';
                                buf[0xe] = '\0';
                                buf[0xf] = '\0';
                                pUVar29 = UniValue::operator[](pUVar27,(string *)buf);
                                uVar20 = UniValue::getInt<int>(pUVar29);
                                if ((char *)buf._0_8_ != buf + 0x10) {
                                  operator_delete((void *)buf._0_8_,
                                                  CONCAT17(buf[0x17],
                                                           CONCAT25(buf._21_2_,
                                                                    CONCAT14(buf[0x14],buf._16_4_)))
                                                  + 1);
                                }
                                if ((int)uVar20 < 0) {
                                  prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            (prVar34,"vout cannot be negative");
                                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                    __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                                std::runtime_error::~runtime_error);
                                  }
                                  goto LAB_0011de7c;
                                }
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
                                     local_358[0];
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
                                     local_358[1];
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
                                     local_358[2];
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
                                     local_358[3];
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
                                     local_358[4];
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
                                     local_358[5];
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
                                     local_358[6];
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
                                     local_358[7];
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
                                     auStack_350[0];
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
                                     auStack_350[1];
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
                                     auStack_350[2];
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
                                     auStack_350[3];
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
                                     auStack_350[4];
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
                                     auStack_350[5];
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
                                     auStack_350[6];
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
                                     auStack_350[7];
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
                                     (char)numkeys;
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
                                     numkeys._1_1_;
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
                                     numkeys._2_1_;
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
                                     numkeys._3_1_;
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
                                     cStack_364;
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
                                     cStack_363;
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
                                     cStack_362;
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
                                     cStack_361;
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
                                     acStack_360[0];
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
                                     acStack_360[1];
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
                                     acStack_360[2];
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
                                     acStack_360[3];
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
                                     acStack_360[4];
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
                                     acStack_360[5];
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
                                     acStack_360[6];
                                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
                                     acStack_360[7];
                                buf._0_8_ = buf + 0x10;
                                unaff_R15 = (MutableTransactionSignatureCreator *)0x7550747069726373
                                ;
                                buf[0x10] = 's';
                                buf[0x11] = 'c';
                                buf[0x12] = 'r';
                                buf[0x13] = 'i';
                                buf[0x14] = 'p';
                                buf[0x15] = 't';
                                buf[0x16] = 'P';
                                buf[0x17] = 'u';
                                buf[0x18] = 'b';
                                buf[0x19] = 'K';
                                buf[0x1a] = 'e';
                                buf[0x1b] = 'y';
                                buf[8] = '\f';
                                buf[9] = '\0';
                                buf[10] = '\0';
                                buf[0xb] = '\0';
                                buf[0xc] = '\0';
                                buf[0xd] = '\0';
                                buf[0xe] = '\0';
                                buf[0xf] = '\0';
                                buf._28_4_ = buf._28_4_ & 0xffffff00;
                                out.n = uVar20;
                                pUVar29 = UniValue::operator[](pUVar27,(string *)buf);
                                pcVar2 = (char *)((long)&scriptPubKey.super_CScriptBase._union +
                                                 0x10);
                                scriptPubKey.super_CScriptBase._union._16_8_ = 0x7550747069726373;
                                scriptPubKey.super_CScriptBase._union._24_4_ = 0x79654b62;
                                scriptPubKey.super_CScriptBase._union._8_8_ = 0xc;
                                scriptPubKey.super_CScriptBase._size =
                                     scriptPubKey.super_CScriptBase._size & 0xffffff00;
                                scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
                                     pcVar2;
                                ParseHexUV(&pkData,pUVar29,(string *)&scriptPubKey);
                                if (scriptPubKey.super_CScriptBase._union.indirect_contents.indirect
                                    != pcVar2) {
                                  operator_delete(scriptPubKey.super_CScriptBase._union.
                                                  indirect_contents.indirect,
                                                  scriptPubKey.super_CScriptBase._union._16_8_ + 1);
                                }
                                if ((char *)buf._0_8_ != buf + 0x10) {
                                  operator_delete((void *)buf._0_8_,
                                                  CONCAT17(buf[0x17],
                                                           CONCAT25(buf._21_2_,
                                                                    CONCAT14(buf[0x14],buf._16_4_)))
                                                  + 1);
                                }
                                prevector<28U,_unsigned_char,_unsigned_int,_int>::
                                prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          (&scriptPubKey.super_CScriptBase,
                                           (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                            )pkData.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start,
                                           (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                            )pkData.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_finish);
                                pCVar31 = CCoinsViewCache::AccessCoin
                                                    ((CCoinsViewCache *)&filename,&out);
                                if ((pCVar31->out).nValue != -1) {
                                  pCVar49 = &(pCVar31->out).scriptPubKey;
                                  bVar16 = prevector<28U,_unsigned_char,_unsigned_int,_int>::
                                           operator==(&pCVar49->super_CScriptBase,
                                                      &scriptPubKey.super_CScriptBase);
                                  if (!bVar16) {
                                    buf._0_8_ = buf + 0x10;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)buf,
                                               "Previous output scriptPubKey mismatch:\n","");
                                    ScriptToAsmStr_abi_cxx11_(&local_438,pCVar49,false);
                                    std::operator+(&local_418,
                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)buf,&local_438);
                                    pbVar32 = std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              ::append(&local_418,"\nvs:\n");
                                    i = (size_t)(pbVar32->_M_dataplus)._M_p;
                                    paVar37 = &pbVar32->field_2;
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)i == paVar37) {
                                      local_3e8._M_allocated_capacity =
                                           paVar37->_M_allocated_capacity;
                                      local_3e8._8_8_ = *(undefined8 *)((long)&pbVar32->field_2 + 8)
                                      ;
                                      i = (size_t)&local_3e8;
                                    }
                                    else {
                                      local_3e8._M_allocated_capacity =
                                           paVar37->_M_allocated_capacity;
                                    }
                                    local_3f0._M_current = (uchar *)pbVar32->_M_string_length;
                                    (pbVar32->_M_dataplus)._M_p = (pointer)paVar37;
                                    pbVar32->_M_string_length = 0;
                                    (pbVar32->field_2)._M_local_buf[0] = '\0';
                                    ScriptToAsmStr_abi_cxx11_(&local_458,&scriptPubKey,false);
                                    std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&redeemScript,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&i,&local_458);
                                    std::__cxx11::
                                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    ::operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)buf,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&redeemScript);
                                    if (redeemScript.super_CScriptBase._union.indirect_contents.
                                        indirect !=
                                        (char *)((long)&redeemScript.super_CScriptBase._union + 0x10
                                                )) {
                                      operator_delete(redeemScript.super_CScriptBase._union.
                                                      indirect_contents.indirect,
                                                      redeemScript.super_CScriptBase._union._16_8_ +
                                                      1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_458._M_dataplus._M_p != &local_458.field_2) {
                                      operator_delete(local_458._M_dataplus._M_p,
                                                      local_458.field_2._M_allocated_capacity + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)i != &local_3e8) {
                                      operator_delete((void *)i,
                                                      (ulong)(local_3e8._M_allocated_capacity + 1));
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_418._M_dataplus._M_p != &local_418.field_2) {
                                      operator_delete(local_418._M_dataplus._M_p,
                                                      local_418.field_2._M_allocated_capacity + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_438._M_dataplus._M_p != &local_438.field_2) {
                                      operator_delete(local_438._M_dataplus._M_p,
                                                      local_438.field_2._M_allocated_capacity + 1);
                                    }
                                    prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error(prVar34,(string *)buf);
                                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                      __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                                  std::runtime_error::~runtime_error);
                                    }
                                    goto LAB_0011de7c;
                                  }
                                }
                                CTxOut::CTxOut((CTxOut *)buf);
                                buf._40_8_ = buf._40_8_ & 0xffffffff00000000;
                                prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                                          ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                           (buf + 8),&scriptPubKey.super_CScriptBase);
                                buf[0] = '\0';
                                buf[1] = '@';
                                buf[2] = '\a';
                                buf[3] = 'Z';
                                buf[4] = -0x10;
                                buf[5] = 'u';
                                buf[6] = '\a';
                                buf[7] = '\0';
                                pcVar2 = (char *)((long)&redeemScript.super_CScriptBase._union +
                                                 0x10);
                                redeemScript.super_CScriptBase._union._8_8_ = 6;
                                redeemScript.super_CScriptBase._union._16_7_ = 0x746e756f6d61;
                                redeemScript.super_CScriptBase._union.indirect_contents.indirect =
                                     pcVar2;
                                bVar16 = UniValue::findKey(pUVar27,(string *)&redeemScript,&i);
                                if (redeemScript.super_CScriptBase._union.indirect_contents.indirect
                                    != pcVar2) {
                                  operator_delete(redeemScript.super_CScriptBase._union.
                                                  indirect_contents.indirect,
                                                  redeemScript.super_CScriptBase._union._16_8_ + 1);
                                }
                                if (bVar16) {
                                  redeemScript.super_CScriptBase._union.indirect_contents.indirect =
                                       (char *)((long)&redeemScript.super_CScriptBase._union + 0x10)
                                  ;
                                  redeemScript.super_CScriptBase._union._8_8_ = 6;
                                  redeemScript.super_CScriptBase._union._16_7_ = 0x746e756f6d61;
                                  pUVar29 = UniValue::operator[](pUVar27,(string *)&redeemScript);
                                  if (pUVar29->typ - VSTR < 2) {
                                    val._M_str = (pUVar29->val)._M_dataplus._M_p;
                                    val._M_len = (pUVar29->val)._M_string_length;
                                    bVar16 = ParseFixedPoint(val,8,(int64_t *)&i);
                                    if (bVar16) {
                                      if (i < 0x775f05a074001) {
                                        buf[0] = (undefined1)i;
                                        buf[1] = i._1_1_;
                                        buf[2] = i._2_1_;
                                        buf[3] = i._3_1_;
                                        buf[4] = i._4_1_;
                                        buf[5] = i._5_1_;
                                        buf[6] = i._6_1_;
                                        buf[7] = i._7_1_;
                                        if (redeemScript.super_CScriptBase._union.indirect_contents.
                                            indirect !=
                                            (char *)((long)&redeemScript.super_CScriptBase._union +
                                                    0x10)) {
                                          operator_delete(redeemScript.super_CScriptBase._union.
                                                          indirect_contents.indirect,
                                                          redeemScript.super_CScriptBase._union.
                                                          _16_8_ + 1);
                                        }
                                        goto LAB_0011a28b;
                                      }
                                      prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                                      std::runtime_error::runtime_error
                                                (prVar34,"Amount out of range");
                                    }
                                    else {
                                      prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                                      std::runtime_error::runtime_error(prVar34,"Invalid amount");
                                    }
                                  }
                                  else {
                                    prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              (prVar34,"Amount is not a number or string");
                                  }
                                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                    __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                                std::runtime_error::~runtime_error);
                                  }
                                  goto LAB_0011de7c;
                                }
LAB_0011a28b:
                                buf._40_8_ = buf._40_8_ & 0xffffffff00000001 | 2;
                                CCoinsViewCache::AddCoin
                                          ((CCoinsViewCache *)&filename,&out,(Coin *)buf,true);
                                if (0x1c < (uint)buf._36_4_) {
                                  free((void *)buf._8_8_);
                                  buf[8] = '\0';
                                  buf[9] = '\0';
                                  buf[10] = '\0';
                                  buf[0xb] = '\0';
                                  buf[0xc] = '\0';
                                  buf[0xd] = '\0';
                                  buf[0xe] = '\0';
                                  buf[0xf] = '\0';
                                }
                                bVar16 = CScript::IsPayToScriptHash(&scriptPubKey);
                                if (bVar16) {
LAB_0011a301:
                                  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
                                  local_478.field_2._M_allocated_capacity = 0x63536d6565646572;
                                  local_478.field_2._8_4_ = 0x74706972;
                                  local_478._M_string_length = 0xc;
                                  local_478.field_2._M_local_buf[0xc] = '\0';
                                  bVar17 = UniValue::findKey(pUVar27,&local_478,(size_t *)buf);
                                  bVar16 = true;
                                }
                                else {
                                  bVar16 = CScript::IsPayToWitnessScriptHash(&scriptPubKey);
                                  if (bVar16) goto LAB_0011a301;
                                  bVar16 = false;
                                  bVar17 = false;
                                }
                                if ((bVar16) &&
                                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_478._M_dataplus._M_p != &local_478.field_2)) {
                                  operator_delete(local_478._M_dataplus._M_p,
                                                  local_478.field_2._M_allocated_capacity + 1);
                                }
                                if (bVar17 != false) {
                                  redeemScript.super_CScriptBase._union.indirect_contents.indirect =
                                       (char *)((long)&redeemScript.super_CScriptBase._union + 0x10)
                                  ;
                                  redeemScript.super_CScriptBase._union._16_8_ = 0x63536d6565646572;
                                  redeemScript.super_CScriptBase._union._24_4_ = 0x74706972;
                                  redeemScript.super_CScriptBase._union._8_8_ = 0xc;
                                  redeemScript.super_CScriptBase._size =
                                       redeemScript.super_CScriptBase._size & 0xffffff00;
                                  pUVar27 = UniValue::operator[](pUVar27,(string *)&redeemScript);
                                  buf._0_4_ = pUVar27->typ;
                                  buf._8_8_ = buf + 0x18;
                                  pcVar47 = (pUVar27->val)._M_dataplus._M_p;
                                  std::__cxx11::string::_M_construct<char*>
                                            ((string *)(buf + 8),pcVar47,
                                             pcVar47 + (pUVar27->val)._M_string_length);
                                  std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)(buf + 0x28),&pUVar27->keys);
                                  std::vector<UniValue,_std::allocator<UniValue>_>::vector
                                            ((vector<UniValue,_std::allocator<UniValue>_> *)
                                             (buf + 0x40),&pUVar27->values);
                                  if (redeemScript.super_CScriptBase._union.indirect_contents.
                                      indirect !=
                                      (char *)((long)&redeemScript.super_CScriptBase._union + 0x10))
                                  {
                                    operator_delete(redeemScript.super_CScriptBase._union.
                                                    indirect_contents.indirect,
                                                    redeemScript.super_CScriptBase._union._16_8_ + 1
                                                   );
                                  }
                                  pcVar2 = (char *)((long)&redeemScript.super_CScriptBase._union +
                                                   0x10);
                                  redeemScript.super_CScriptBase._union._16_8_ = 0x63536d6565646572;
                                  redeemScript.super_CScriptBase._union._24_4_ = 0x74706972;
                                  redeemScript.super_CScriptBase._union._8_8_ = 0xc;
                                  redeemScript.super_CScriptBase._size =
                                       redeemScript.super_CScriptBase._size & 0xffffff00;
                                  unaff_R15 = (MutableTransactionSignatureCreator *)&redeemScript;
                                  redeemScript.super_CScriptBase._union.indirect_contents.indirect =
                                       pcVar2;
                                  ParseHexUV((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)&i,(UniValue *)buf,(string *)unaff_R15);
                                  if (redeemScript.super_CScriptBase._union.indirect_contents.
                                      indirect != pcVar2) {
                                    operator_delete(redeemScript.super_CScriptBase._union.
                                                    indirect_contents.indirect,
                                                    redeemScript.super_CScriptBase._union._16_8_ + 1
                                                   );
                                  }
                                  prevector<28U,_unsigned_char,_unsigned_int,_int>::
                                  prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                             unaff_R15,
                                             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                              )i,local_3f0);
                                  FillableSigningProvider::AddCScript
                                            ((FillableSigningProvider *)&strHexTx,
                                             (CScript *)unaff_R15);
                                  if (0x1c < redeemScript.super_CScriptBase._size) {
                                    free(redeemScript.super_CScriptBase._union.indirect_contents.
                                         indirect);
                                    redeemScript.super_CScriptBase._union.indirect_contents.indirect
                                         = (char *)0x0;
                                  }
                                  if (i != 0) {
                                    operator_delete((void *)i,local_3e8._M_allocated_capacity - i);
                                  }
                                  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                                            ((vector<UniValue,_std::allocator<UniValue>_> *)
                                             (buf + 0x40));
                                  std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)(buf + 0x28));
                                  if ((char *)buf._8_8_ != buf + 0x18) {
                                    operator_delete((void *)buf._8_8_,
                                                    CONCAT44(buf._28_4_,
                                                             CONCAT13(buf[0x1b],buf._24_3_)) + 1);
                                  }
                                }
                                if (0x1c < scriptPubKey.super_CScriptBase._size) {
                                  free(scriptPubKey.super_CScriptBase._union.indirect_contents.
                                       indirect);
                                  scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
                                       (char *)0x0;
                                }
                                if (pkData.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(pkData.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)pkData.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)pkData.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                std::
                                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>_>_>
                                ::~_Rb_tree(&types._M_t);
                                sVar44 = (size_t)((int)sVar44 + 1);
                                uVar46 = ((long)prevtxsObj.values.
                                                super__Vector_base<UniValue,_std::allocator<UniValue>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)prevtxsObj.values.
                                                super__Vector_base<UniValue,_std::allocator<UniValue>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                         0x2e8ba2e8ba2e8ba3;
                              } while (sVar44 <= uVar46 && uVar46 - sVar44 != 0);
                            }
                            if (mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                _M_impl.super__Vector_impl_data._M_finish !=
                                mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                _M_impl.super__Vector_impl_data._M_start) {
                              in_stack_ffffffffffffe9c4 = in_stack_ffffffffffffe9b4 & 0xffffff7f;
                              uVar46 = 0;
                              do {
                                input = mergedTx.vin.
                                        super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                        super__Vector_impl_data._M_start + uVar46;
                                txout = &CCoinsViewCache::AccessCoin
                                                   ((CCoinsViewCache *)&filename,&input->prevout)->
                                         out;
                                uVar19 = (uint)uVar46;
                                if (txout->nValue != -1) {
                                  DataFromTransaction((SignatureData *)buf,&mergedTx,uVar19,txout);
                                  if ((in_stack_ffffffffffffe9c4 != 3) ||
                                     (uVar28 = ((long)mergedTx.vout.
                                                                                                            
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)mergedTx.vout.
                                                                                                            
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                               -0x3333333333333333,
                                     uVar46 <= uVar28 && uVar28 - uVar46 != 0)) {
                                    unaff_R15 = (MutableTransactionSignatureCreator *)&types;
                                    in_R8 = (allocator_type *)(ulong)in_stack_ffffffffffffe9b4;
                                    MutableTransactionSignatureCreator::
                                    MutableTransactionSignatureCreator
                                              (unaff_R15,&mergedTx,uVar19,&txout->nValue,
                                               in_stack_ffffffffffffe9b4);
                                    ProduceSignature((SigningProvider *)&strHexTx,
                                                     (BaseSignatureCreator *)unaff_R15,
                                                     &txout->scriptPubKey,(SignatureData *)buf);
                                  }
                                  if ((txout->nValue == 2100000000000000) &&
                                     (CONCAT44(buf._108_4_,buf._104_4_) !=
                                      CONCAT44(buf._116_4_,buf._112_4_))) {
                                    prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                                    uVar19 = (txout->scriptPubKey).super_CScriptBase._size;
                                    pbVar32 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)(ulong)uVar19;
                                    uVar38 = uVar19 - 0x1d;
                                    pCVar49 = (CScript *)
                                              (txout->scriptPubKey).super_CScriptBase._union.
                                              indirect_contents.indirect;
                                    if (uVar19 < 0x1d) {
                                      uVar38 = uVar19;
                                      pCVar49 = &txout->scriptPubKey;
                                    }
                                    s.m_size._0_4_ = uVar38;
                                    s.m_data = (uchar *)pCVar49;
                                    s.m_size._4_4_ = 0;
                                    HexStr_abi_cxx11_((string *)&out,s);
                                    tinyformat::format<std::__cxx11::string>
                                              ((string *)&types,
                                               (tinyformat *)
                                               "Missing amount for CTxOut with scriptPubKey=%s",
                                               (char *)&out,pbVar32);
                                    std::runtime_error::runtime_error(prVar34,(string *)&types);
                                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                      __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                                  std::runtime_error::~runtime_error);
                                    }
                                    goto LAB_0011de7c;
                                  }
                                  UpdateInput(input,(SignatureData *)buf);
                                  SignatureData::~SignatureData((SignatureData *)buf);
                                }
                                uVar46 = (ulong)(uVar19 + 1);
                                uVar28 = ((long)mergedTx.vin.
                                                super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                          (long)mergedTx.vin.
                                                super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                _M_impl.super__Vector_impl_data._M_start >> 3) *
                                         0x4ec4ec4ec4ec4ec5;
                              } while (uVar46 <= uVar28 && uVar28 - uVar46 != 0);
                            }
                            std::vector<CTxIn,_std::allocator<CTxIn>_>::operator=
                                      (&tx.vin,&mergedTx.vin);
                            std::vector<CTxOut,_std::allocator<CTxOut>_>::operator=
                                      (&tx.vout,&mergedTx.vout);
                            tx.version = mergedTx.version;
                            tx.nLockTime = mergedTx.nLockTime;
                            std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                                      (&prevtxsObj.values);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~vector(&prevtxsObj.keys);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)prevtxsObj.val._M_dataplus._M_p != &prevtxsObj.val.field_2) {
                              operator_delete(prevtxsObj.val._M_dataplus._M_p,
                                              CONCAT44(prevtxsObj.val.field_2._M_allocated_capacity.
                                                       _4_4_,prevtxsObj.val.field_2.
                                                             _M_allocated_capacity._0_4_) + 1);
                            }
                            std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_2b0);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~vector(&local_2c8);
                            if ((undefined1 *)valStr._M_string_length !=
                                (undefined1 *)((long)&valStr.field_2 + 8)) {
                              operator_delete((void *)valStr._M_string_length,
                                              CONCAT17(valStr.field_2._M_local_buf[0xf],
                                                       CONCAT25(valStr.field_2._13_2_,
                                                                CONCAT14(valStr.field_2._M_local_buf
                                                                         [0xc],valStr.field_2._8_4_)
                                                               )) + 1);
                            }
                            strHexTx._M_dataplus._M_p = (pointer)ppuVar53;
                            std::
                            _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                            ::~_Rb_tree(&local_260);
                            std::
                            _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                            ::~_Rb_tree((_Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                                         *)&strHexTx._M_string_length);
                            filename._M_dataplus._M_p = (pointer)&PTR_GetCoin_003dc168;
                            std::
                            _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            ::~_Hashtable(&local_98);
                            if (local_d0 != '\0') {
                              (local_d8->second).m_prev = local_e0;
                              (local_e0->second).m_next = local_d8;
                              local_d0 = '\0';
                            }
                            if (0x1c < local_a4) {
                              free(local_c0.indirect_contents.indirect);
                              local_c0.indirect_contents.indirect = (char *)0x0;
                            }
                            PoolResource<144UL,_8UL>::~PoolResource
                                      ((PoolResource<144UL,_8UL> *)(local_1e0 + 0x10));
                            std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txv.vout);
                            std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&txv.vin);
                            std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&mergedTx.vout);
                            std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&mergedTx.vin);
                            goto LAB_00119106;
                          }
                          prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    (prVar34,"prevtxs register variable must be set.");
                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                            __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                        }
                      }
                      else {
                        iVar18 = std::__cxx11::
                                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                 compare(&key,"load");
                        sVar41 = value._M_string_length;
                        _Var36 = value._M_dataplus;
                        if (iVar18 == 0) {
                          if (value._M_string_length == 0) {
                            sVar35 = 0xffffffffffffffff;
                          }
                          else {
                            pvVar21 = memchr(value._M_dataplus._M_p,0x3a,value._M_string_length);
                            sVar35 = -(ulong)(pvVar21 == (void *)0x0) |
                                     (long)pvVar21 - (long)_Var36._M_p;
                          }
                          if ((sVar35 != sVar41 - 1) && (1 < sVar35 + 1)) {
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            substr(&strHexTx,&value,0,sVar35);
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            substr(&filename,&value,sVar35 + 1,0xffffffffffffffff);
                            valStr._M_dataplus = filename._M_dataplus;
                            std::filesystem::__cxx11::path::
                            path<char_const*,std::filesystem::__cxx11::path>
                                      ((path *)buf,(char **)&valStr,auto_format);
                            __stream = fsbridge::fopen(buf,"r");
                            std::filesystem::__cxx11::path::~path((path *)buf);
                            if (__stream == (FILE *)0x0) {
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)buf,"Cannot open file ",&filename);
                              prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error(prVar34,(string *)buf);
                              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                            }
                            else {
                              valStr._M_dataplus._M_p = (pointer)&valStr.field_2;
                              valStr._M_string_length._0_4_ = 0;
                              valStr._M_string_length._4_4_ = 0;
                              valStr.field_2._M_allocated_capacity._0_4_ =
                                   valStr.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
                              while( true ) {
                                iVar18 = feof(__stream);
                                if (iVar18 != 0) break;
                                iVar18 = ferror(__stream);
                                if (iVar18 != 0) break;
                                sVar24 = fread((CTxIn *)buf,1,0x1000,__stream);
                                if ((int)(uint)sVar24 < 1) break;
                                in_R8 = (allocator_type *)(ulong)((uint)sVar24 & 0x7fffffff);
                                std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                replace(&valStr,CONCAT44(valStr._M_string_length._4_4_,
                                                         (undefined4)valStr._M_string_length),0,buf,
                                        (size_type)in_R8);
                              }
                              iVar18 = ferror(__stream);
                              fclose(__stream);
                              if (iVar18 == 0) {
                                RegisterSetJson(&strHexTx,&valStr);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)valStr._M_dataplus._M_p != &valStr.field_2) {
                                  operator_delete(valStr._M_dataplus._M_p,
                                                  CONCAT44(valStr.field_2._M_allocated_capacity.
                                                           _4_4_,valStr.field_2.
                                                                 _M_allocated_capacity._0_4_) + 1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)filename._M_dataplus._M_p != &filename.field_2) {
                                  uVar46 = CONCAT26(filename.field_2._M_allocated_capacity._6_2_,
                                                    CONCAT24(filename.field_2._M_allocated_capacity.
                                                             _4_2_,filename.field_2.
                                                                   _M_allocated_capacity._0_4_)) + 1
                                  ;
                                  _Var36._M_p = filename._M_dataplus._M_p;
                                  goto LAB_0011989d;
                                }
                                goto LAB_001198a2;
                              }
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)buf,"Error reading file ",&filename);
                              prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error(prVar34,(string *)buf);
                              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                            }
                            goto LAB_0011de7c;
                          }
                          prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    (prVar34,"Register load requires NAME:FILENAME");
                        }
                        else {
                          iVar18 = std::__cxx11::
                                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   ::compare(&key,"set");
                          sVar41 = value._M_string_length;
                          _Var36 = value._M_dataplus;
                          if (iVar18 == 0) {
                            if (value._M_string_length == 0) {
                              sVar35 = 0xffffffffffffffff;
                            }
                            else {
                              pvVar21 = memchr(value._M_dataplus._M_p,0x3a,value._M_string_length);
                              sVar35 = -(ulong)(pvVar21 == (void *)0x0) |
                                       (long)pvVar21 - (long)_Var36._M_p;
                            }
                            if ((sVar35 != sVar41 - 1) && (1 < sVar35 + 1)) {
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)buf,&value,0,sVar35);
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              substr(&filename,&value,sVar35 + 1,0xffffffffffffffff);
                              RegisterSetJson((string *)buf,&filename);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)filename._M_dataplus._M_p != &filename.field_2) {
                                operator_delete(filename._M_dataplus._M_p,
                                                CONCAT26(filename.field_2._M_allocated_capacity.
                                                         _6_2_,CONCAT24(filename.field_2.
                                                                        _M_allocated_capacity._4_2_,
                                                                        filename.field_2.
                                                                        _M_allocated_capacity._0_4_)
                                                        ) + 1);
                              }
                              if ((char *)buf._0_8_ == buf + 0x10) goto LAB_00119106;
                              lVar48 = CONCAT17(buf[0x17],
                                                CONCAT25(buf._21_2_,CONCAT14(buf[0x14],buf._16_4_)))
                              ;
                              _Var36._M_p = (pointer)buf._0_8_;
                              goto LAB_001198c3;
                            }
                            prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      (prVar34,"Register input requires NAME:VALUE");
                          }
                          else {
                            prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error(prVar34,"unknown command");
                          }
                        }
LAB_0011c27c:
                        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                          __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                      }
                    }
                    goto LAB_0011de7c;
                  }
                  buf._0_8_ = value._M_dataplus._M_p;
                  buf[8] = (undefined1)value._M_string_length;
                  buf[9] = value._M_string_length._1_1_;
                  buf[10] = value._M_string_length._2_1_;
                  buf[0xb] = value._M_string_length._3_1_;
                  buf[0xc] = value._M_string_length._4_1_;
                  buf[0xd] = value._M_string_length._5_1_;
                  buf[0xe] = value._M_string_length._6_1_;
                  buf[0xf] = value._M_string_length._7_1_;
                  strHexTx._M_dataplus._M_p._0_1_ = 0x3a;
                  separators_03._M_str = (char *)in_R8;
                  separators_03._M_len = (size_t)&strHexTx;
                  util::Split<std::__cxx11::string>
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&mergedTx,(util *)buf,(Span<const_char> *)0x1,separators_03);
                  if ((ulong)((long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_start) < 0x21) {
                    prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar34,"TX output missing separator");
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    goto LAB_0011de7c;
                  }
                  types._M_t._M_impl._0_8_ =
                       ExtractAndValidateValue
                                 ((string *)
                                  mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                  filename._M_dataplus._M_p = (pointer)&filename.field_2;
                  lVar48 = *(long *)&((mergedTx.vin.
                                       super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                       super__Vector_impl_data._M_start)->prevout).n;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&filename,lVar48,
                             ((mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start)->scriptSig).
                             super_CScriptBase._union.indirect_contents.indirect + lVar48);
                  ParseScript((CScript *)&strHexTx,&filename);
                  if ((long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)mergedTx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start == 0x60) {
                    buf._0_8_ = buf + 0x10;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)buf,
                               *(long *)&mergedTx.vin.
                                         super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                         super__Vector_impl_data._M_finish[-1].nSequence,
                               (long)&((mergedTx.vin.
                                        super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                        super__Vector_impl_data._M_finish[-1].scriptWitness.stack.
                                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      )._M_impl +
                               *(long *)&mergedTx.vin.
                                         super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                         super__Vector_impl_data._M_finish[-1].nSequence);
                    uVar7 = buf._8_8_;
                    uVar4 = buf._0_8_;
                    if (buf._8_8_ == 0) {
                      bVar17 = false;
                      bVar16 = false;
                    }
                    else {
                      pvVar21 = memchr((void *)buf._0_8_,0x57,buf._8_8_);
                      uVar13 = buf._0_8_;
                      bVar17 = (long)pvVar21 - uVar4 != -1 && pvVar21 != (void *)0x0;
                      pvVar21 = memchr((void *)buf._0_8_,0x53,uVar7);
                      bVar16 = (long)pvVar21 - uVar13 != -1 && pvVar21 != (void *)0x0;
                    }
                    if ((char *)buf._0_8_ != buf + 0x10) {
                      operator_delete((void *)buf._0_8_,
                                      CONCAT17(buf[0x17],
                                               CONCAT25(buf._21_2_,CONCAT14(buf[0x14],buf._16_4_)))
                                      + 1);
                    }
                  }
                  else {
                    bVar17 = false;
                    bVar16 = false;
                  }
                  if (0x272d < (uint)strHexTx.field_2._12_4_) {
                    prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                    uVar5 = strHexTx.field_2._12_4_ + -0x1d;
                    if ((uint)strHexTx.field_2._12_4_ < 0x1d) {
                      uVar5 = strHexTx.field_2._12_4_;
                    }
                    valStr._M_dataplus._M_p._0_4_ = uVar5;
                    tinyformat::format<unsigned_int,int>
                              ((string *)buf,(tinyformat *)"script exceeds size limit: %d > %d",
                               (char *)&valStr,&MAX_SCRIPT_SIZE,(int *)in_R8);
                    std::runtime_error::runtime_error(prVar34,(string *)buf);
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    goto LAB_0011de7c;
                  }
                  if (bVar17) {
                    WitnessV0ScriptHash::WitnessV0ScriptHash
                              ((WitnessV0ScriptHash *)&prevtxsObj,(CScript *)&strHexTx);
                    buf._16_4_ = (undefined4)prevtxsObj.val._M_string_length;
                    buf[0x14] = (char)(prevtxsObj.val._M_string_length >> 0x20);
                    buf._21_2_ = (undefined2)(prevtxsObj.val._M_string_length >> 0x28);
                    buf[0x17] = (char)(prevtxsObj.val._M_string_length >> 0x38);
                    buf._24_3_ = (undefined3)prevtxsObj.val.field_2._M_allocated_capacity._0_4_;
                    buf[0x1b] = (char)((uint)prevtxsObj.val.field_2._0_4_ >> 0x18);
                    buf[0x1c] = prevtxsObj.val.field_2._4_1_;
                    buf[0x1d] = prevtxsObj.val.field_2._5_1_;
                    buf[0x1e] = prevtxsObj.val.field_2._6_1_;
                    buf[0x1f] = prevtxsObj.val.field_2._7_1_;
                    buf._0_8_ = prevtxsObj._0_8_;
                    buf._8_8_ = prevtxsObj.val._M_dataplus._M_p;
                    buf[0x48] = '\x04';
                    GetScriptForDestination((CScript *)&valStr,(CTxDestination *)buf);
                    if (0x1c < (uint)strHexTx.field_2._12_4_) {
                      free(strHexTx._M_dataplus._M_p);
                    }
                    strHexTx.field_2._M_allocated_capacity._0_4_ =
                         valStr.field_2._M_allocated_capacity._0_4_;
                    strHexTx.field_2._M_allocated_capacity._4_4_ =
                         valStr.field_2._M_allocated_capacity._4_4_;
                    strHexTx.field_2._8_4_ = valStr.field_2._8_4_;
                    strHexTx._M_dataplus = valStr._M_dataplus;
                    strHexTx.field_2._12_4_ =
                         CONCAT13(valStr.field_2._M_local_buf[0xf],
                                  CONCAT21(valStr.field_2._13_2_,valStr.field_2._M_local_buf[0xc]));
                    valStr.field_2._M_local_buf[0xc] = '\0';
                    valStr.field_2._13_2_ = 0;
                    valStr.field_2._M_local_buf[0xf] = '\0';
                    strHexTx._M_string_length = valStr._M_string_length;
                    std::__detail::__variant::
                    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                         *)buf);
                  }
                  if (bVar16) {
                    if (0x225 < (uint)strHexTx.field_2._12_4_) {
                      prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
                      uVar5 = strHexTx.field_2._12_4_ + -0x1d;
                      if ((uint)strHexTx.field_2._12_4_ < 0x1d) {
                        uVar5 = strHexTx.field_2._12_4_;
                      }
                      valStr._M_dataplus._M_p._0_4_ = uVar5;
                      tinyformat::format<unsigned_int,unsigned_int>
                                ((string *)buf,
                                 (tinyformat *)"redeemScript exceeds size limit: %d > %d",
                                 (char *)&valStr,&MAX_SCRIPT_ELEMENT_SIZE,(uint *)in_R8);
                      std::runtime_error::runtime_error(prVar34,(string *)buf);
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        __cxa_throw(prVar34,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      goto LAB_0011de7c;
                    }
                    ScriptHash::ScriptHash((ScriptHash *)&prevtxsObj,(CScript *)&strHexTx);
                    sVar41 = prevtxsObj.val._M_string_length;
                    buf[0x10] = (char)prevtxsObj.val._M_string_length;
                    buf[0x11] = prevtxsObj.val._M_string_length._1_1_;
                    buf[0x12] = prevtxsObj.val._M_string_length._2_1_;
                    buf[0x13] = prevtxsObj.val._M_string_length._3_1_;
                    buf._0_8_ = prevtxsObj._0_8_;
                    buf._8_8_ = prevtxsObj.val._M_dataplus._M_p;
                    buf[0x48] = '\x03';
                    prevtxsObj.val._M_string_length = sVar41;
                    GetScriptForDestination((CScript *)&valStr,(CTxDestination *)buf);
                    if (0x1c < (uint)strHexTx.field_2._12_4_) {
                      free(strHexTx._M_dataplus._M_p);
                    }
                    strHexTx.field_2._M_allocated_capacity._0_4_ =
                         valStr.field_2._M_allocated_capacity._0_4_;
                    strHexTx.field_2._M_allocated_capacity._4_4_ =
                         valStr.field_2._M_allocated_capacity._4_4_;
                    strHexTx.field_2._8_4_ = valStr.field_2._8_4_;
                    strHexTx._M_dataplus = valStr._M_dataplus;
                    strHexTx.field_2._12_4_ =
                         CONCAT13(valStr.field_2._M_local_buf[0xf],
                                  CONCAT21(valStr.field_2._13_2_,valStr.field_2._M_local_buf[0xc]));
                    valStr.field_2._M_local_buf[0xc] = '\0';
                    valStr.field_2._13_2_ = 0;
                    valStr.field_2._M_local_buf[0xf] = '\0';
                    strHexTx._M_string_length = valStr._M_string_length;
                    std::__detail::__variant::
                    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                         *)buf);
                  }
                  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&valStr,
                             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&strHexTx);
                  scriptPubKeyIn_03.super_CScriptBase._union._8_8_ = in_stack_ffffffffffffe990;
                  scriptPubKeyIn_03.super_CScriptBase._union.indirect_contents.indirect =
                       in_stack_ffffffffffffe988._M_p;
                  scriptPubKeyIn_03.super_CScriptBase._union._16_8_ = in_stack_ffffffffffffe998;
                  scriptPubKeyIn_03.super_CScriptBase._24_8_ = in_stack_ffffffffffffe9a0;
                  CTxOut::CTxOut((CTxOut *)buf,(CAmount *)&types,scriptPubKeyIn_03);
                  if (0x1c < CONCAT13(valStr.field_2._M_local_buf[0xf],
                                      CONCAT21(valStr.field_2._13_2_,
                                               valStr.field_2._M_local_buf[0xc]))) {
                    free(valStr._M_dataplus._M_p);
                    valStr._M_dataplus._M_p = (pointer)0x0;
                  }
                  std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back
                            (&tx.vout,(value_type *)buf);
                  if (0x1c < (uint)buf._36_4_) {
                    free((void *)buf._8_8_);
                    buf[8] = '\0';
                    buf[9] = '\0';
                    buf[10] = '\0';
                    buf[0xb] = '\0';
                    buf[0xc] = '\0';
                    buf[0xd] = '\0';
                    buf[0xe] = '\0';
                    buf[0xf] = '\0';
                  }
                  if (0x1c < (uint)strHexTx.field_2._12_4_) {
                    free(strHexTx._M_dataplus._M_p);
                    strHexTx._M_dataplus._M_p = (pointer)0x0;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)filename._M_dataplus._M_p != &filename.field_2) {
                    lVar48 = CONCAT26(filename.field_2._M_allocated_capacity._6_2_,
                                      CONCAT24(filename.field_2._M_allocated_capacity._4_2_,
                                               filename.field_2._M_allocated_capacity._0_4_));
                    _Var36._M_p = filename._M_dataplus._M_p;
                    goto LAB_001183ed;
                  }
                }
LAB_001190f9:
                pUVar27 = (UniValue *)&mergedTx;
              }
LAB_00119101:
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)pUVar27);
            }
          }
        }
      }
LAB_00119106:
      std::unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_>::~unique_ptr
                ((unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> *)&local_15e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value._M_dataplus._M_p != &value.field_2) {
        operator_delete(value._M_dataplus._M_p,
                        CONCAT71(value.field_2._M_allocated_capacity._1_7_,
                                 value.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)key._M_dataplus._M_p != &key.field_2) {
        operator_delete(key._M_dataplus._M_p,
                        CONCAT71(key.field_2._M_allocated_capacity._1_7_,key.field_2._M_local_buf[0]
                                ) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)arg._M_dataplus._M_p != &arg.field_2) {
        operator_delete(arg._M_dataplus._M_p,arg.field_2._M_allocated_capacity + 1);
      }
      uVar45 = uVar45 + 1;
    } while (uVar45 != uVar40);
  }
  CTransaction::CTransaction((CTransaction *)buf,&tx);
  paVar37 = &filename.field_2;
  filename.field_2._M_allocated_capacity._0_4_ = 0x6f736a2d;
  filename.field_2._M_allocated_capacity._4_2_ = 0x6e;
  filename._M_string_length._0_4_ = 5;
  filename._M_string_length._4_4_ = 0;
  filename._M_dataplus._M_p = (pointer)paVar37;
  bVar16 = ArgsManager::GetBoolArg(&gArgs,&filename,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != paVar37) {
    operator_delete(filename._M_dataplus._M_p,
                    CONCAT26(filename.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(filename.field_2._M_allocated_capacity._4_2_,
                                      filename.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if (bVar16) {
    valStr._M_dataplus._M_p = (pointer)&valStr.field_2;
    valStr._M_string_length._0_4_ = 0;
    valStr._M_string_length._4_4_ = 0;
    puVar3 = (undefined1 *)((long)&filename.field_2 + 8);
    filename._M_dataplus._M_p._0_4_ = 1;
    filename.field_2._8_4_ = valStr.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    filename.field_2._12_4_ = valStr.field_2._M_allocated_capacity._4_4_;
    filename.field_2._M_allocated_capacity._0_4_ = 0;
    filename.field_2._M_allocated_capacity._4_2_ = 0;
    filename.field_2._M_allocated_capacity._6_2_ = 0;
    valStr.field_2._M_allocated_capacity._0_4_ =
         valStr.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    local_1e0._0_8_ = (pointer)0x0;
    local_1e0._8_8_ = (pointer)0x0;
    local_1e0._16_8_ = (pointer)0x0;
    avStack_1c8[0].super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    avStack_1c8[0].super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    avStack_1c8[0].super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    strHexTx.field_2._M_allocated_capacity._0_4_ = 0;
    strHexTx.field_2._M_allocated_capacity._4_4_ = 0;
    strHexTx.field_2._8_4_ = 0;
    strHexTx.field_2._12_4_ = 0;
    strHexTx._M_dataplus._M_p = (pointer)0x0;
    strHexTx._M_string_length._0_4_ = 0;
    strHexTx._M_string_length._4_4_ = 0;
    filename._M_string_length = (size_type)puVar3;
    TxToUniv((CTransaction *)buf,(uint256 *)&strHexTx,(UniValue *)&filename,true,(CTxUndo *)0x0,
             SHOW_DETAILS);
    UniValue::write_abi_cxx11_(&prevtxsObj,(int)&filename,(void *)0x4,0);
    strHexTx._M_dataplus._M_p = (pointer)&strHexTx.field_2;
    strHexTx._M_string_length._0_4_ = 1;
    strHexTx.field_2._8_4_ = 0x12030a;
    strHexTx.field_2._12_4_ = 0;
    strHexTx.field_2._M_allocated_capacity = (size_type)&prevtxsObj;
    tinyformat::detail::formatImpl
              ((ostream *)&std::cout,"%s\n",(FormatArg *)strHexTx._M_dataplus._M_p,1);
    if ((size_type *)prevtxsObj._0_8_ != &prevtxsObj.val._M_string_length) {
      operator_delete((void *)prevtxsObj._0_8_,prevtxsObj.val._M_string_length + 1);
    }
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(avStack_1c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1e0);
    sVar41 = filename._M_string_length;
    if ((undefined1 *)filename._M_string_length != puVar3) {
      lVar48 = CONCAT44(filename.field_2._12_4_,filename.field_2._8_4_);
LAB_0011abae:
      operator_delete((void *)filename._M_string_length,lVar48 + 1);
      filename._M_string_length = sVar41;
      sVar41 = filename._M_string_length;
    }
  }
  else {
    filename.field_2._M_allocated_capacity._0_4_ = 0x6978742d;
    filename.field_2._M_allocated_capacity._4_2_ = 100;
    filename._M_string_length._0_4_ = 5;
    filename._M_string_length._4_4_ = 0;
    filename._M_dataplus._M_p = (pointer)paVar37;
    bVar16 = ArgsManager::GetBoolArg(&gArgs,&filename,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)filename._M_dataplus._M_p != paVar37) {
      operator_delete(filename._M_dataplus._M_p,
                      CONCAT26(filename.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(filename.field_2._M_allocated_capacity._4_2_,
                                        filename.field_2._M_allocated_capacity._0_4_)) + 1);
    }
    if (bVar16) {
      base_blob<256u>::GetHex_abi_cxx11_(&valStr,buf + 0x39);
      strHexTx._M_dataplus._M_p = (pointer)&strHexTx.field_2;
      strHexTx._M_string_length._0_4_ = 1;
      strHexTx.field_2._8_4_ = 0x12030a;
      strHexTx.field_2._12_4_ = 0;
      strHexTx.field_2._M_allocated_capacity = (size_type)&valStr;
      tinyformat::detail::formatImpl
                ((ostream *)&std::cout,"%s\n",(FormatArg *)strHexTx._M_dataplus._M_p,1);
    }
    else {
      EncodeHexTx_abi_cxx11_(&valStr,(CTransaction *)buf);
      strHexTx._M_dataplus._M_p = (pointer)&strHexTx.field_2;
      strHexTx._M_string_length._0_4_ = 1;
      strHexTx.field_2._8_4_ = 0x12030a;
      strHexTx.field_2._12_4_ = 0;
      strHexTx.field_2._M_allocated_capacity = (size_type)&valStr;
      tinyformat::detail::formatImpl
                ((ostream *)&std::cout,"%s\n",(FormatArg *)strHexTx._M_dataplus._M_p,1);
    }
    sVar41 = CONCAT44(filename._M_string_length._4_4_,(undefined4)filename._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)valStr._M_dataplus._M_p != &valStr.field_2) {
      lVar48 = CONCAT44(valStr.field_2._M_allocated_capacity._4_4_,
                        valStr.field_2._M_allocated_capacity._0_4_);
      filename._M_string_length = (size_type)valStr._M_dataplus._M_p;
      goto LAB_0011abae;
    }
  }
  filename._M_string_length = sVar41;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(buf + 0x18));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector((vector<CTxIn,_std::allocator<CTxIn>_> *)buf);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx.vin);
  iVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                     (&strPrint,"");
  if (iVar18 != 0) {
    filename._M_dataplus._M_p = (pointer)&filename.field_2;
    filename._M_string_length._0_4_ = 1;
    filename.field_2._M_allocated_capacity._0_4_ = SUB84(&strPrint,0);
    filename.field_2._M_allocated_capacity._4_2_ = (undefined2)((ulong)&strPrint >> 0x20);
    filename.field_2._M_allocated_capacity._6_2_ = (undefined2)((ulong)&strPrint >> 0x30);
    filename.field_2._8_4_ = 0x12030a;
    filename.field_2._12_4_ = 0;
    tinyformat::detail::formatImpl
              ((ostream *)&std::cout,"%s\n",(FormatArg *)filename._M_dataplus._M_p,1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strPrint._M_dataplus._M_p != &strPrint.field_2) {
    operator_delete(strPrint._M_dataplus._M_p,
                    CONCAT71(strPrint.field_2._M_allocated_capacity._1_7_,
                             strPrint.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return 0;
  }
LAB_0011de7c:
  __stack_chk_fail();
}

Assistant:

static int CommandLineRawTx(int argc, char* argv[])
{
    std::string strPrint;
    int nRet = 0;
    try {
        // Skip switches; Permit common stdin convention "-"
        while (argc > 1 && IsSwitchChar(argv[1][0]) &&
               (argv[1][1] != 0)) {
            argc--;
            argv++;
        }

        CMutableTransaction tx;
        int startArg;

        if (!fCreateBlank) {
            // require at least one param
            if (argc < 2)
                throw std::runtime_error("too few parameters");

            // param: hex-encoded bitcoin transaction
            std::string strHexTx(argv[1]);
            if (strHexTx == "-")                 // "-" implies standard input
                strHexTx = readStdin();

            if (!DecodeHexTx(tx, strHexTx, true))
                throw std::runtime_error("invalid transaction encoding");

            startArg = 2;
        } else
            startArg = 1;

        for (int i = startArg; i < argc; i++) {
            std::string arg = argv[i];
            std::string key, value;
            size_t eqpos = arg.find('=');
            if (eqpos == std::string::npos)
                key = arg;
            else {
                key = arg.substr(0, eqpos);
                value = arg.substr(eqpos + 1);
            }

            MutateTx(tx, key, value);
        }

        OutputTx(CTransaction(tx));
    }
    catch (const std::exception& e) {
        strPrint = std::string("error: ") + e.what();
        nRet = EXIT_FAILURE;
    }
    catch (...) {
        PrintExceptionContinue(nullptr, "CommandLineRawTx()");
        throw;
    }

    if (strPrint != "") {
        tfm::format(nRet == 0 ? std::cout : std::cerr, "%s\n", strPrint);
    }
    return nRet;
}